

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalJacobianContIntDamping
          (ChElementShellANCF_3443 *this,ChMatrixRef *H,double Kfactor,double Rfactor)

{
  ulong uVar1;
  ChKblockGeneric *pCVar2;
  undefined1 (*pauVar3) [64];
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  long lVar52;
  PointerType pdVar53;
  uint uVar54;
  undefined8 uVar55;
  long lVar56;
  ulong uVar57;
  double *pdVar58;
  bool bVar59;
  char *__function;
  int iVar60;
  long lVar61;
  long lVar62;
  pointer pLVar63;
  long lVar64;
  long lVar65;
  ChElementShellANCF_3443 *this_00;
  undefined1 (*pauVar66) [64];
  undefined1 (*pauVar67) [64];
  int iVar68;
  ulong uVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  ActualDstType actualDst;
  long lVar74;
  ChMatrixRef *dst;
  long lVar75;
  Index outer;
  long lVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  double dVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  Matrix<double,__1,__1,_1,__1,__1> Scaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> DScaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> PE;
  VectorNIP E_BlockDamping;
  ChMatrixNM<double,_6,_6> D;
  DstEvaluatorType dstEvaluator_1;
  VectorNIP E6_Block;
  VectorNIP E5_Block;
  VectorNIP E4_Block;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  ChMatrixNM<double,_NSF,_3_*_NIP>_conflict3 S_scaled_SD;
  MatrixNx6 ebar_ebardot;
  DenseStorage<double,__1,__1,__1,_1> local_6e20;
  DenseStorage<double,__1,__1,__1,_1> local_6e00;
  ChMatrixRef *local_6de0;
  int local_6dd8;
  int local_6dd4;
  ulong local_6dd0;
  long local_6dc8;
  DenseStorage<double,__1,__1,__1,_1> local_6dc0;
  long local_6da0;
  double local_6d98;
  long local_6d90;
  assign_op<double,_double> *local_6d88;
  undefined1 local_6d80 [32];
  undefined8 uStack_6d60;
  ulong uStack_6d58;
  undefined1 auStack_6d50 [16];
  undefined1 local_6d40 [64];
  undefined1 local_6d00 [64];
  undefined1 local_6cc0 [64];
  undefined1 local_6c80 [64];
  undefined1 local_6c20 [96];
  Matrix<double,_16,_6,_1,_16,_6> *local_6bc0;
  pointer local_6bb8;
  pointer local_6bb0;
  ChLoadableUV local_6ba8;
  ChLoadableUVW local_6ba0;
  pointer local_6b98;
  Matrix<double,_16,_6,_1,_16,_6> *local_6b90;
  pointer local_6b88;
  pointer local_6b80;
  ChLoadableUV local_6b78;
  ChLoadableUVW local_6b70;
  pointer local_6b68;
  Matrix<double,_16,_6,_1,_16,_6> *local_6b60;
  pointer local_6b58;
  pointer local_6b50;
  ChLoadableUV local_6b48;
  ChLoadableUVW local_6b40;
  pointer local_6b38;
  Matrix<double,_16,_6,_1,_16,_6> *local_6b30;
  pointer local_6b28;
  pointer local_6b20;
  ChLoadableUV local_6b18;
  ChLoadableUVW local_6b10;
  pointer local_6b08;
  undefined1 local_6b00 [64];
  undefined1 local_6ac0 [16];
  undefined1 *puStack_6ab0;
  DstXprType *pDStack_6aa8;
  undefined1 auStack_6aa0 [32];
  undefined1 local_6a80 [64];
  undefined1 local_6a40 [64];
  undefined1 local_6a00 [64];
  double local_69a0;
  double local_6998;
  double local_6990;
  double local_6988;
  undefined1 local_6980 [64];
  undefined1 local_6940 [64];
  undefined1 local_6900 [64];
  undefined1 local_68c0 [64];
  undefined1 local_6880 [64];
  undefined1 local_6840 [64];
  undefined1 local_6800 [64];
  undefined1 local_67c0 [64];
  undefined1 local_6780 [64];
  undefined1 local_6740 [64];
  undefined1 local_6700 [64];
  undefined1 local_66c0 [64];
  undefined1 local_6680 [64];
  undefined1 local_6640 [64];
  undefined1 local_6600 [64];
  undefined1 local_65c0 [64];
  undefined1 local_6580 [64];
  undefined1 local_6540 [64];
  undefined1 local_6500 [64];
  undefined1 local_64c0 [64];
  undefined1 local_6480 [64];
  undefined1 local_6440 [64];
  undefined1 local_6400 [64];
  undefined1 local_63c0 [64];
  undefined1 local_6380 [64];
  undefined1 local_6340 [64];
  undefined1 local_6300 [64];
  undefined1 local_62c0 [64];
  undefined1 local_6280 [64];
  undefined1 local_6240 [64];
  undefined1 local_6200 [64];
  undefined1 local_61c0 [64];
  undefined1 local_6180 [64];
  undefined1 local_6140 [64];
  undefined1 local_6100 [64];
  undefined1 local_60c0 [64];
  undefined1 local_6080 [64];
  undefined1 local_6040 [64];
  undefined1 local_6000 [64];
  undefined1 local_5fc0 [64];
  undefined1 local_5f80 [64];
  undefined1 local_5f40 [64];
  undefined1 local_5f00 [64];
  undefined1 local_5ec0 [64];
  undefined1 local_5e80 [64];
  undefined1 local_5e40 [64];
  undefined1 local_5e00 [64];
  undefined1 local_5dc0 [64];
  undefined1 local_5d80 [64];
  undefined1 local_5d40 [64];
  undefined1 local_5d00 [64];
  undefined1 local_5cc0 [64];
  undefined1 local_5c80 [64];
  undefined1 local_5c40 [64];
  undefined1 local_5c00 [64];
  undefined1 local_5bc0 [64];
  undefined1 local_5b80 [64];
  undefined1 local_5b40 [64];
  undefined1 local_5b00 [64];
  undefined1 local_5ac0 [64];
  undefined1 local_5a80 [64];
  undefined1 local_5a40 [64];
  undefined1 local_5a00 [64];
  undefined1 local_59c0 [64];
  undefined1 local_5980 [64];
  undefined1 local_5940 [64];
  undefined1 local_5900 [64];
  undefined1 local_58c0 [64];
  undefined1 local_5880 [64];
  undefined1 local_5840 [64];
  undefined1 local_5800 [64];
  undefined1 local_57c0 [64];
  undefined1 local_5780 [64];
  undefined1 local_5740 [64];
  undefined1 local_5700 [64];
  undefined1 local_56c0 [64];
  undefined1 local_5680 [64];
  undefined1 local_5640 [64];
  undefined1 local_5600 [64];
  undefined1 local_55c0 [64];
  undefined1 local_5580 [64];
  undefined1 local_5540 [64];
  undefined1 local_5500 [64];
  undefined1 local_54c0 [64];
  undefined1 local_5480 [64];
  undefined1 local_5440 [64];
  undefined1 local_5400 [64];
  undefined1 local_53c0 [64];
  undefined1 local_5380 [64];
  undefined1 local_5340 [64];
  undefined1 local_5300 [64];
  undefined1 local_52c0 [64];
  undefined1 local_5280 [64];
  undefined1 local_5240 [64];
  undefined1 local_5200 [64];
  undefined1 local_51c0 [64];
  undefined1 local_5180 [64];
  undefined1 local_5140 [64];
  undefined1 local_5100 [64];
  undefined1 local_50c0 [64];
  undefined1 local_5080 [64];
  undefined1 local_5040 [64];
  undefined1 local_5000 [64];
  undefined1 local_4fc0 [64];
  undefined1 local_4f80 [64];
  undefined1 local_4f40 [64];
  undefined1 local_4f00 [64];
  undefined1 local_4ec0 [64];
  undefined1 local_4e80 [64];
  undefined1 local_4e40 [64];
  undefined1 local_4e00 [64];
  undefined1 local_4dc0 [64];
  undefined1 local_4d80 [64];
  undefined1 local_4d40 [64];
  undefined1 local_4d00 [64];
  undefined1 local_4cc0 [64];
  undefined1 local_4c80 [64];
  undefined1 local_4c40 [64];
  undefined1 local_4c00 [64];
  undefined1 local_4bc0 [64];
  undefined1 local_4b80 [64];
  undefined1 local_4b40 [64];
  undefined1 local_4b00 [64];
  undefined1 local_4ac0 [64];
  undefined1 local_4a80 [64];
  undefined1 local_4a40 [64];
  undefined1 local_4a00 [64];
  undefined1 local_49c0 [64];
  undefined1 local_4980 [64];
  undefined1 local_4940 [64];
  undefined1 local_4900 [64];
  undefined1 local_48c0 [64];
  undefined1 local_4880 [64];
  undefined1 local_4840 [64];
  undefined1 local_4800 [64];
  undefined1 local_47c0 [64];
  undefined1 local_4780 [64];
  undefined1 local_4740 [64];
  undefined1 local_4700 [64];
  undefined1 local_46c0 [64];
  undefined1 local_4680 [64];
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined1 local_45c0 [64];
  undefined1 local_4580 [64];
  undefined1 local_4540 [64];
  undefined1 local_4500 [64];
  undefined1 local_44c0 [64];
  undefined1 local_4480 [64];
  undefined1 local_4440 [64];
  undefined1 local_4400 [64];
  undefined1 local_43c0 [64];
  undefined1 local_4380 [64];
  undefined1 local_4340 [64];
  undefined1 local_4300 [64];
  undefined1 local_42c0 [64];
  undefined1 local_4280 [64];
  undefined1 local_4240 [64];
  undefined1 local_4200 [64];
  undefined1 local_41c0 [64];
  undefined1 local_4180 [64];
  undefined1 local_4140 [64];
  undefined1 local_4100 [64];
  undefined1 local_40c0 [64];
  undefined1 local_4080 [64];
  undefined1 local_4040 [64];
  undefined1 local_4000 [64];
  undefined1 local_3fc0 [64];
  undefined1 local_3f80 [64];
  undefined1 local_3f40 [64];
  undefined1 local_3f00 [64];
  undefined1 local_3ec0 [64];
  undefined1 local_3e80 [64];
  undefined1 local_3e40 [64];
  undefined1 local_3e00 [64];
  undefined1 local_3dc0 [64];
  undefined1 local_3d80 [64];
  undefined1 local_3d40 [64];
  undefined1 local_3d00 [64];
  undefined1 local_3cc0 [64];
  undefined1 local_3c80 [64];
  undefined1 local_3c40 [64];
  undefined1 local_3c00 [64];
  undefined1 local_3bc0 [64];
  undefined1 local_3b80 [64];
  undefined1 local_3b40 [64];
  undefined1 local_3b00 [64];
  undefined1 local_3ac0 [64];
  undefined1 local_3a80 [64];
  undefined1 local_3a40 [64];
  undefined1 local_3a00 [64];
  undefined1 local_39c0 [64];
  undefined1 local_3980 [64];
  undefined1 local_3940 [64];
  undefined1 local_3900 [64];
  undefined1 local_38c0 [64];
  undefined1 local_3880 [64];
  undefined1 local_3840 [64];
  undefined1 local_3800 [64];
  undefined1 local_37c0 [64];
  undefined1 local_3780 [64];
  undefined1 local_3740 [64];
  undefined1 local_3700 [64];
  undefined1 local_36c0 [64];
  undefined1 local_3680 [64];
  undefined1 local_3640 [64];
  undefined1 local_3600 [64];
  undefined1 local_35c0 [64];
  undefined1 local_3580 [64];
  undefined1 local_3540 [64];
  undefined1 local_3500 [64];
  undefined1 local_34c0 [64];
  undefined1 local_3480 [64];
  undefined1 local_3440 [64];
  undefined1 local_3400 [64];
  undefined1 local_33c0 [64];
  undefined1 local_3380 [8];
  Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> TStack_3378;
  assign_op<double,_double> *paStack_3370;
  variable_if_dynamic<long,__1> vStack_3368;
  variable_if_dynamic<long,__1> vStack_3360;
  long lStack_3358;
  Matrix<double,_16,_6,_1,_16,_6> *pMStack_3350;
  double *local_3340;
  ulong uStack_3330;
  pointer psStack_3320;
  double *pdStack_3310;
  ulong local_3300;
  pointer psStack_32f0;
  double *pdStack_32e0;
  ulong uStack_32d0;
  ChLoadableUV local_32c0;
  double *pdStack_32b0;
  ulong uStack_32a0;
  ChLoadableUVW CStack_3290;
  double *local_3280;
  ulong uStack_3270;
  pointer pLStack_3260;
  double *pdStack_3250;
  ulong local_3240;
  undefined1 local_30c0 [11584];
  MatrixNx6 local_380;
  
  local_6d98 = Kfactor;
  local_69a0 = Rfactor;
  CalcCombinedCoordMatrix(this,&local_380);
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_cols.m_value |
      (H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  TStack_3378.m_matrix = (non_const_type)local_5180;
  local_3380 = (undefined1  [8])local_6380;
  local_5180._0_8_ = 0.0;
  local_6380._0_8_ =
       (H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_data;
  local_6380._16_8_ =
       (H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).m_stride.m_outer.m_value;
  paStack_3370 = (assign_op<double,_double> *)local_6c20;
  vStack_3368.m_value = (long)H;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_3380);
  if (0 < this->m_numLayers) {
    local_6d88 = (assign_op<double,_double> *)&this->m_SD;
    local_6dd4 = 0x40;
    local_6dd8 = 0x20;
    local_6dd0 = 0;
    lVar75 = 0;
    local_6de0 = H;
    do {
      if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows < 0x10) {
LAB_00773a6e:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 16, 96>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 16, BlockCols = 96, InnerPanel = false]"
        ;
LAB_00773a14:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
      }
      uVar54 = (int)lVar75 * 0x60;
      uVar57 = CONCAT44(0,uVar54);
      lVar56 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_cols;
      local_6988 = (double)(uVar57 + 0x60);
      if (lVar56 < (long)local_6988) goto LAB_00773a6e;
      local_6dc8 = uVar57 * 8;
      local_3380 = (undefined1  [8])(*(long *)local_6d88 + local_6dc8);
      paStack_3370 = local_6d88;
      vStack_3368.m_value = 0;
      local_6d90 = lVar75;
      vStack_3360.m_value = uVar57;
      lStack_3358 = lVar56;
      pMStack_3350 = &local_380;
      memset((Matrix<double,_96,_6,_0,_96,_6> *)local_6380,0,0x1200);
      local_5180._0_8_ = 1.0;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,16,96,false>>,Eigen::Matrix<double,16,6,1,16,6>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,96,6,0,96,6>>
                ((Matrix<double,_96,_6,_0,_96,_6> *)local_6380,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_16,_96,_false>_>
                  *)local_3380,&local_380,(Scalar *)local_5180);
      local_6dc0.m_cols = 0;
      local_6dc0.m_data = (double *)0x0;
      local_6dc0.m_rows = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_6dc0,0x2400,0x30,0xc0);
      auVar82 = local_6b00;
      local_6da0 = (long)local_6dd4;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = local_6d98;
      local_6998 = (double)(long)local_6dd8;
      local_6980._0_8_ = uVar57;
      lVar71 = 0;
      local_6c80._0_8_ = local_6dc0.m_rows;
      lVar65 = 0;
      local_6700._0_8_ = local_6dc0.m_cols * 0x18;
      lVar72 = local_6dc0.m_cols * 0x10;
      local_6dd0 = local_6dd0 & 0xffffffff;
      lVar56 = (long)(int)uVar54;
      iVar60 = uVar54 + 0x20;
      iVar68 = uVar54 + 0x40;
      uVar57 = lVar56 + 0x20;
      lVar76 = (long)iVar60;
      local_66c0._0_4_ = iVar60;
      lVar74 = (long)iVar68;
      local_6b00._0_4_ = iVar68;
      uVar1 = lVar76 + 0x20;
      lVar75 = lVar74 + 0x20;
      pauVar66 = (undefined1 (*) [64])(local_6dc0.m_data + 0xb8);
      do {
        auVar80 = local_6c80;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar65) ||
             (lVar62 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar62 < (long)uVar57)) || (local_6dc0.m_rows <= lVar71))
           || (local_6dc0.m_cols < 0x20)) goto LAB_007739e8;
        lVar62 = lVar62 * lVar65;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        auVar78._8_8_ = local_6380._8_8_;
        auVar78._0_8_ = local_6380._0_8_;
        auVar78._16_8_ = local_6380._16_8_;
        auVar78._24_40_ = local_6380._24_40_;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62),auVar78);
        pauVar66[-0x17] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 8),local_6340);
        pauVar66[-0x16] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x10),local_6300
                                );
        pauVar66[-0x15] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x18),local_62c0
                                );
        pauVar66[-0x14] = auVar78;
        if (((iVar60 < 0) ||
            ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar65)) ||
           ((lVar62 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar62 < (long)uVar1 || ((ulong)local_6dc0.m_cols < 0x40))))
        goto LAB_007739e8;
        lVar62 = lVar62 * lVar65;
        local_6840._0_8_ = lVar76 * 8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62),local_6280);
        pauVar66[-0x13] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 8),local_6240);
        pauVar66[-0x12] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x10),local_6200
                                );
        pauVar66[-0x11] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x18),local_61c0
                                );
        pauVar66[-0x10] = auVar78;
        if (((iVar68 < 0) ||
            ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar65)) ||
           ((lVar62 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar62 < lVar75 || ((ulong)local_6dc0.m_cols < 0x60))))
        goto LAB_007739e8;
        lVar62 = lVar62 * lVar65;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62),local_6180);
        pauVar66[-0xf] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 8),local_6140);
        pauVar66[-0xe] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x10),local_6100
                                );
        pauVar66[-0xd] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x18),local_60c0
                                );
        pauVar66[-0xc] = auVar78;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar65) ||
             (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, (long)uVar69 < lVar75)) || (uVar69 < uVar1)) ||
           ((ulong)local_6dc0.m_cols < 0x80)) goto LAB_007739e8;
        lVar62 = uVar69 * lVar65;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62),local_6280);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62),local_6180);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        pauVar66[-0xb] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 8),local_6240);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 8),local_6140);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        pauVar66[-10] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x10),local_6200
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x10),local_6100
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        pauVar66[-9] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x18),local_61c0
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x18),local_60c0
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        pauVar66[-8] = auVar78;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < lVar75)) ||
           ((uVar69 < uVar57 || ((ulong)local_6dc0.m_cols < 0xa0)))) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = uVar69 * lVar65;
        auVar79._8_8_ = local_6380._8_8_;
        auVar79._0_8_ = local_6380._0_8_;
        auVar79._16_8_ = local_6380._16_8_;
        auVar79._24_40_ = local_6380._24_40_;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62),auVar79);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62),local_6180);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        pauVar66[-7] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 8),local_6340);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 8),local_6140);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        pauVar66[-6] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x10),local_6300
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x10),local_6100
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        pauVar66[-5] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x18),local_62c0
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x18),local_60c0
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        pauVar66[-4] = auVar78;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < (long)uVar1)) ||
           ((uVar69 < uVar57 || ((ulong)local_6dc0.m_cols < 0xc0)))) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = uVar69 * lVar65;
        auVar81._8_8_ = local_6380._8_8_;
        auVar81._0_8_ = local_6380._0_8_;
        auVar81._16_8_ = local_6380._16_8_;
        auVar81._24_40_ = local_6380._24_40_;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62),auVar81);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62),local_6280);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        pauVar66[-3] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 8),local_6340);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 8),local_6240);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        pauVar66[-2] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x10),local_6300
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x10),local_6200
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        pauVar66[-1] = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x18),local_62c0
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x18),local_61c0
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *pauVar66 = auVar78;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (lVar62 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar62 < (long)uVar57)) ||
           ((ulong)local_6dc0.m_rows <= lVar71 + 1U)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = lVar62 * lVar65;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62),local_6080);
        *(undefined1 (*) [64])(pauVar66[-0x17] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 8),local_6040);
        *(undefined1 (*) [64])(pauVar66[-0x16] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x10),local_6000
                                );
        *(undefined1 (*) [64])(pauVar66[-0x15] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x18),local_5fc0
                                );
        *(undefined1 (*) [64])(pauVar66[-0x14] + local_6dc0.m_cols * 8) = auVar78;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar65) ||
           (lVar62 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar62 < (long)uVar1)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = lVar62 * lVar65;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62),local_5f80);
        *(undefined1 (*) [64])(pauVar66[-0x13] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 8),local_5f40);
        *(undefined1 (*) [64])(pauVar66[-0x12] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x10),local_5f00
                                );
        *(undefined1 (*) [64])(pauVar66[-0x11] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x18),local_5ec0
                                );
        *(undefined1 (*) [64])(pauVar66[-0x10] + local_6dc0.m_cols * 8) = auVar78;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar65) ||
           (lVar62 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar62 < lVar75)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = lVar62 * lVar65;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62),local_5e80);
        *(undefined1 (*) [64])(pauVar66[-0xf] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 8),local_5e40);
        *(undefined1 (*) [64])(pauVar66[-0xe] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x10),local_5e00
                                );
        *(undefined1 (*) [64])(pauVar66[-0xd] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x18),local_5dc0
                                );
        *(undefined1 (*) [64])(pauVar66[-0xc] + local_6dc0.m_cols * 8) = auVar78;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < lVar75)) || (uVar69 < uVar1))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = uVar69 * lVar65;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62),local_5f80);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62),local_5e80);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-0xb] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 8),local_5f40);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 8),local_5e40);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-10] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x10),local_5f00
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x10),local_5e00
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-9] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x18),local_5ec0
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x18),local_5dc0
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-8] + local_6dc0.m_cols * 8) = auVar78;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < lVar75)) || (uVar69 < uVar57))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = uVar69 * lVar65;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62),local_6080);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62),local_5e80);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-7] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 8),local_6040);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 8),local_5e40);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-6] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x10),local_6000
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x10),local_5e00
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-5] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x18),local_5fc0
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x18),local_5dc0
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-4] + local_6dc0.m_cols * 8) = auVar78;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < (long)uVar1)) || (uVar69 < uVar57))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = uVar69 * lVar65;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62),local_6080);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62),local_5f80);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-3] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 8),local_6040);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 8),local_5f40);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-2] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x10),local_6000
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x10),local_5f00
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-1] + local_6dc0.m_cols * 8) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x18),local_5fc0
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x18),local_5ec0
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(*pauVar66 + local_6dc0.m_cols * 8) = auVar78;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (lVar62 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar62 < (long)uVar57)) ||
           ((ulong)local_6dc0.m_rows <= lVar71 + 2U)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = lVar62 * lVar65;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62),local_5d80);
        *(undefined1 (*) [64])(pauVar66[-0x17] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 8),local_5d40);
        *(undefined1 (*) [64])(pauVar66[-0x16] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x10),local_5d00
                                );
        *(undefined1 (*) [64])(pauVar66[-0x15] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x18),local_5cc0
                                );
        *(undefined1 (*) [64])(pauVar66[-0x14] + lVar72) = auVar78;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar65) ||
           (lVar62 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar62 < (long)uVar1)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = lVar62 * lVar65;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62),local_5c80);
        *(undefined1 (*) [64])(pauVar66[-0x13] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 8),local_5c40);
        *(undefined1 (*) [64])(pauVar66[-0x12] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x10),local_5c00
                                );
        *(undefined1 (*) [64])(pauVar66[-0x11] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x18),local_5bc0
                                );
        *(undefined1 (*) [64])(pauVar66[-0x10] + lVar72) = auVar78;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar65) ||
           (lVar62 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar62 < lVar75)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = lVar62 * lVar65;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62),local_5b80);
        *(undefined1 (*) [64])(pauVar66[-0xf] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 8),local_5b40);
        *(undefined1 (*) [64])(pauVar66[-0xe] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x10),local_5b00
                                );
        *(undefined1 (*) [64])(pauVar66[-0xd] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x18),local_5ac0
                                );
        *(undefined1 (*) [64])(pauVar66[-0xc] + lVar72) = auVar78;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < lVar75)) || (uVar69 < uVar1))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = uVar69 * lVar65;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62),local_5c80);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62),local_5b80);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-0xb] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 8),local_5c40);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 8),local_5b40);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-10] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x10),local_5c00
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x10),local_5b00
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-9] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x18),local_5bc0
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x18),local_5ac0
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-8] + lVar72) = auVar78;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < lVar75)) || (uVar69 < uVar57))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = uVar69 * lVar65;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62),local_5d80);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62),local_5b80);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-7] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 8),local_5d40);
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 8),local_5b40);
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-6] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x10),local_5d00
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x10),local_5b00
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-5] + lVar72) = auVar78;
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar62 + 0x18),local_5cc0
                                );
        auVar79 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x18),local_5ac0
                                );
        auVar78 = vaddpd_avx512f(auVar78,auVar79);
        *(undefined1 (*) [64])(pauVar66[-4] + lVar72) = auVar78;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar65) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < (long)uVar1)) || (uVar69 < uVar57))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar62 = uVar69 * lVar65;
        lVar71 = lVar71 + 3;
        lVar65 = lVar65 + 1;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62),local_5d80);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62),local_5c80);
        auVar80 = vaddpd_avx512f(auVar80,auVar78);
        *(undefined1 (*) [64])(pauVar66[-3] + lVar72) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 8),local_5d40);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 8),local_5c40);
        auVar80 = vaddpd_avx512f(auVar80,auVar78);
        *(undefined1 (*) [64])(pauVar66[-2] + lVar72) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x10),local_5d00
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x10),local_5c00
                                );
        auVar80 = vaddpd_avx512f(auVar80,auVar78);
        *(undefined1 (*) [64])(pauVar66[-1] + lVar72) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar62 + 0x18),local_5cc0
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar56 + lVar62 + 0x18),local_5bc0
                                );
        auVar80 = vaddpd_avx512f(auVar80,auVar78);
        *(undefined1 (*) [64])(*pauVar66 + lVar72) = auVar80;
        pauVar66 = (undefined1 (*) [64])(*pauVar66 + local_6dc0.m_cols * 0x18);
      } while (lVar71 != 0x30);
      auVar112._8_8_ = 0;
      auVar112._0_8_ = this->m_Alpha;
      auVar113._8_8_ = 0;
      auVar113._0_8_ = local_69a0;
      local_6c20._8_8_ = local_5a80;
      lVar56 = 0x2c0;
      auVar114 = vfmadd213sd_fma(auVar113,auVar112,auVar114);
      local_6c20._0_8_ = this->m_Alpha * local_6d98;
      local_3380 = (undefined1  [8])auVar114._0_8_;
      TStack_3378.m_matrix = (non_const_type)local_6380;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_6c20._0_8_;
      auVar80 = vbroadcastsd_avx512f(auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = auVar114._0_8_;
      auVar78 = vbroadcastsd_avx512f(auVar7);
      do {
        auVar79 = vmulpd_avx512f(auVar78,*(undefined1 (*) [64])(local_6640 + lVar56));
        auVar81 = vmulpd_avx512f(auVar80,*(undefined1 (*) [64])(local_5d40 + lVar56));
        auVar79 = vaddpd_avx512f(auVar79,auVar81);
        *(undefined1 (*) [64])(local_5440 + lVar56) = auVar79;
        auVar79 = vmulpd_avx512f(auVar78,*(undefined1 (*) [64])(local_6600 + lVar56));
        auVar81 = vmulpd_avx512f(auVar80,*(undefined1 (*) [64])(local_5d00 + lVar56));
        auVar79 = vaddpd_avx512f(auVar79,auVar81);
        *(undefined1 (*) [64])(local_5400 + lVar56) = auVar79;
        auVar79 = vmulpd_avx512f(auVar78,*(undefined1 (*) [64])(local_65c0 + lVar56));
        auVar81 = vmulpd_avx512f(auVar80,*(undefined1 (*) [64])(local_5cc0 + lVar56));
        auVar79 = vaddpd_avx512f(auVar79,auVar81);
        *(undefined1 (*) [64])(local_53c0 + lVar56) = auVar79;
        auVar79 = vmulpd_avx512f(auVar78,*(undefined1 (*) [64])(local_6580 + lVar56));
        auVar81 = vmulpd_avx512f(auVar80,*(undefined1 (*) [64])(local_5c80 + lVar56));
        auVar79 = vaddpd_avx512f(auVar79,auVar81);
        *(undefined1 (*) [64])(local_5380 + lVar56) = auVar79;
        auVar79 = vmulpd_avx512f(auVar78,*(undefined1 (*) [64])(local_6540 + lVar56));
        auVar81 = vmulpd_avx512f(auVar80,*(undefined1 (*) [64])(local_5c40 + lVar56));
        auVar79 = vaddpd_avx512f(auVar79,auVar81);
        *(undefined1 (*) [64])(local_5340 + lVar56) = auVar79;
        auVar79 = vmulpd_avx512f(auVar78,*(undefined1 (*) [64])(local_6500 + lVar56));
        auVar81 = vmulpd_avx512f(auVar80,*(undefined1 (*) [64])(local_5c00 + lVar56));
        auVar79 = vaddpd_avx512f(auVar79,auVar81);
        *(undefined1 (*) [64])(local_5300 + lVar56) = auVar79;
        auVar79 = vmulpd_avx512f(auVar78,*(undefined1 (*) [64])(local_64c0 + lVar56));
        auVar81 = vmulpd_avx512f(auVar80,*(undefined1 (*) [64])(local_5bc0 + lVar56));
        auVar79 = vaddpd_avx512f(auVar79,auVar81);
        *(undefined1 (*) [64])(local_52c0 + lVar56) = auVar79;
        auVar79 = vmulpd_avx512f(auVar78,*(undefined1 (*) [64])(local_6480 + lVar56));
        auVar81 = vmulpd_avx512f(auVar80,*(undefined1 (*) [64])(local_5b80 + lVar56));
        auVar79 = vaddpd_avx512f(auVar79,auVar81);
        *(undefined1 (*) [64])(local_5280 + lVar56) = auVar79;
        auVar79 = vmulpd_avx512f(auVar78,*(undefined1 (*) [64])(local_6440 + lVar56));
        auVar81 = vmulpd_avx512f(auVar80,*(undefined1 (*) [64])(local_5b40 + lVar56));
        auVar79 = vaddpd_avx512f(auVar79,auVar81);
        *(undefined1 (*) [64])(local_5240 + lVar56) = auVar79;
        auVar79 = vmulpd_avx512f(auVar78,*(undefined1 (*) [64])(local_6400 + lVar56));
        auVar81 = vmulpd_avx512f(auVar80,*(undefined1 (*) [64])(local_5b00 + lVar56));
        auVar79 = vaddpd_avx512f(auVar79,auVar81);
        *(undefined1 (*) [64])(local_5200 + lVar56) = auVar79;
        auVar79 = vmulpd_avx512f(auVar78,*(undefined1 (*) [64])(local_63c0 + lVar56));
        auVar81 = vmulpd_avx512f(auVar80,*(undefined1 (*) [64])(local_5ac0 + lVar56));
        auVar79 = vaddpd_avx512f(auVar79,auVar81);
        *(undefined1 (*) [64])(local_51c0 + lVar56) = auVar79;
        auVar79 = vmulpd_avx512f(auVar78,*(undefined1 (*) [64])
                                          ((long)&(((non_const_type)local_6380)->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data + lVar56));
        auVar81 = vmulpd_avx512f(auVar80,*(undefined1 (*) [64])(local_6c20._8_8_ + lVar56));
        auVar79 = vaddpd_avx512f(auVar79,auVar81);
        *(undefined1 (*) [64])(local_5180 + lVar56) = auVar79;
        lVar56 = lVar56 + 0x300;
      } while (lVar56 != 0xbc0);
      local_6700._0_8_ = local_6d90 * 0x20 + 0x20;
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < (long)local_6700._0_8_) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_00773a38;
      pdVar58 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar56 = 0x2c0;
      do {
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6d90 * 0x20),
                                 *(undefined1 (*) [64])(local_5440 + lVar56));
        *(undefined1 (*) [64])(local_5440 + lVar56) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6d90 * 0x20 + 8),
                                 *(undefined1 (*) [64])(local_5400 + lVar56));
        *(undefined1 (*) [64])(local_5400 + lVar56) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6d90 * 0x20 + 0x10),
                                 *(undefined1 (*) [64])(local_53c0 + lVar56));
        *(undefined1 (*) [64])(local_53c0 + lVar56) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6d90 * 0x20 + 0x18),
                                 *(undefined1 (*) [64])(local_5380 + lVar56));
        *(undefined1 (*) [64])(local_5380 + lVar56) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6d90 * 0x20),
                                 *(undefined1 (*) [64])(local_5340 + lVar56));
        *(undefined1 (*) [64])(local_5340 + lVar56) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6d90 * 0x20 + 8),
                                 *(undefined1 (*) [64])(local_5300 + lVar56));
        *(undefined1 (*) [64])(local_5300 + lVar56) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6d90 * 0x20 + 0x10),
                                 *(undefined1 (*) [64])(local_52c0 + lVar56));
        *(undefined1 (*) [64])(local_52c0 + lVar56) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6d90 * 0x20 + 0x18),
                                 *(undefined1 (*) [64])(local_5280 + lVar56));
        *(undefined1 (*) [64])(local_5280 + lVar56) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6d90 * 0x20),
                                 *(undefined1 (*) [64])(local_5240 + lVar56));
        *(undefined1 (*) [64])(local_5240 + lVar56) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6d90 * 0x20 + 8),
                                 *(undefined1 (*) [64])(local_5200 + lVar56));
        *(undefined1 (*) [64])(local_5200 + lVar56) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6d90 * 0x20 + 0x10),
                                 *(undefined1 (*) [64])(local_51c0 + lVar56));
        *(undefined1 (*) [64])(local_51c0 + lVar56) = auVar80;
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6d90 * 0x20 + 0x18),
                                 *(undefined1 (*) [64])(local_5180 + lVar56));
        *(undefined1 (*) [64])(local_5180 + lVar56) = auVar80;
        lVar56 = lVar56 + 0x300;
      } while (lVar56 != 0xbc0);
      local_6b00._8_56_ = auVar82._8_56_;
      local_6b00._0_8_ = local_6d90 * 0x20;
      local_6e20.m_cols = 0;
      local_6e20.m_data = (double *)0x0;
      local_6e20.m_rows = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_6e20,0x2400,0x30,0xc0);
      dst = local_6de0;
      lVar65 = 0;
      lVar71 = 0;
      uVar57 = local_6980._0_8_ + 0x20;
      pauVar66 = (undefined1 (*) [64])(local_6e20.m_data + 0xb8);
      lVar56 = local_6e20.m_cols * 0x10;
      local_6c80._0_8_ = uVar57;
      local_66c0._0_8_ = local_6e20.m_cols * 0x18;
      do {
        auVar80 = local_6c80;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar71) ||
             (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, lVar72 < (long)uVar57)) || (local_6e20.m_rows <= lVar65))
           || (local_6e20.m_cols < 0x20)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = lVar72 * lVar71;
        auVar82._8_56_ = local_5180._8_56_;
        auVar82._0_8_ = local_5180._0_8_;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])((long)pdVar58 + lVar72 * 8 + local_6dc8),
                                 auVar82);
        pauVar66[-0x17] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6dc8 + 0x40),local_5140);
        pauVar66[-0x16] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6dc8 + 0x80),local_5100);
        pauVar66[-0x15] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6dc8 + 0xc0),local_50c0);
        pauVar66[-0x14] = auVar82;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar71) ||
            (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar72 < (long)uVar1)) || ((ulong)local_6e20.m_cols < 0x40))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = lVar72 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6840._0_8_),local_5080);
        pauVar66[-0x13] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6840._0_8_ + 0x40),local_5040)
        ;
        pauVar66[-0x12] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6840._0_8_ + 0x80),local_5000)
        ;
        pauVar66[-0x11] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6840._0_8_ + 0xc0),local_4fc0)
        ;
        pauVar66[-0x10] = auVar82;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar71) ||
            (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar72 < lVar75)) || ((ulong)local_6e20.m_cols < 0x60))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = lVar72 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72),local_4f80);
        pauVar66[-0xf] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 8),local_4f40);
        pauVar66[-0xe] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x10),local_4f00
                                );
        pauVar66[-0xd] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x18),local_4ec0
                                );
        pauVar66[-0xc] = auVar82;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar71) ||
             (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, (long)uVar69 < lVar75)) || (uVar69 < uVar1)) ||
           ((ulong)local_6e20.m_cols < 0x80)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = uVar69 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72),local_5080);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72),local_4f80);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        pauVar66[-0xb] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 8),local_5040);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 8),local_4f40);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        pauVar66[-10] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x10),local_5000
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 0x10),local_4f00
                                );
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        pauVar66[-9] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x18),local_4fc0
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 0x18),local_4ec0
                                );
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        pauVar66[-8] = auVar82;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar71) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < lVar75)) ||
           ((uVar69 < uVar57 || ((ulong)local_6e20.m_cols < 0xa0)))) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = uVar69 * lVar71;
        auVar83._8_56_ = local_5180._8_56_;
        auVar83._0_8_ = local_5180._0_8_;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72),auVar83);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72),
                                 local_4f80);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        pauVar66[-7] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 8),local_5140);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 8),
                                 local_4f40);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        pauVar66[-6] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x10),local_5100
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 0x10),
                                 local_4f00);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        pauVar66[-5] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x18),local_50c0
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 0x18),
                                 local_4ec0);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        pauVar66[-4] = auVar82;
        if (((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows <= lVar71) ||
             (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols, (long)uVar69 < (long)uVar1)) || (uVar69 < uVar57)) ||
           ((ulong)local_6e20.m_cols < 0xc0)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = uVar69 * lVar71;
        auVar84._8_56_ = local_5180._8_56_;
        auVar84._0_8_ = local_5180._0_8_;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72),auVar84);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72),
                                 local_5080);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        pauVar66[-3] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 8),local_5140);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 8),
                                 local_5040);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        pauVar66[-2] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 0x10),local_5100
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 0x10),
                                 local_5000);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        pauVar66[-1] = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 0x18),local_50c0
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 0x18),
                                 local_4fc0);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *pauVar66 = auVar82;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar71) ||
            (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar72 < (long)uVar57)) ||
           ((ulong)local_6e20.m_rows <= lVar65 + 1U)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = lVar72 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])((long)pdVar58 + lVar72 * 8 + local_6dc8),
                                 local_4e80);
        *(undefined1 (*) [64])(pauVar66[-0x17] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6dc8 + 0x40),local_4e40);
        *(undefined1 (*) [64])(pauVar66[-0x16] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6dc8 + 0x80),local_4e00);
        *(undefined1 (*) [64])(pauVar66[-0x15] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6dc8 + 0xc0),local_4dc0);
        *(undefined1 (*) [64])(pauVar66[-0x14] + local_6e20.m_cols * 8) = auVar82;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar71) ||
           (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar72 < (long)uVar1)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = lVar72 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6840._0_8_),local_4d80);
        *(undefined1 (*) [64])(pauVar66[-0x13] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6840._0_8_ + 0x40),local_4d40)
        ;
        *(undefined1 (*) [64])(pauVar66[-0x12] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6840._0_8_ + 0x80),local_4d00)
        ;
        *(undefined1 (*) [64])(pauVar66[-0x11] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6840._0_8_ + 0xc0),local_4cc0)
        ;
        *(undefined1 (*) [64])(pauVar66[-0x10] + local_6e20.m_cols * 8) = auVar82;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar71) ||
           (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar72 < lVar75)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = lVar72 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72),local_4c80);
        *(undefined1 (*) [64])(pauVar66[-0xf] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 8),local_4c40);
        *(undefined1 (*) [64])(pauVar66[-0xe] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x10),local_4c00
                                );
        *(undefined1 (*) [64])(pauVar66[-0xd] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x18),local_4bc0
                                );
        *(undefined1 (*) [64])(pauVar66[-0xc] + local_6e20.m_cols * 8) = auVar82;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar71) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < lVar75)) || (uVar69 < uVar1))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = uVar69 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72),local_4d80);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72),local_4c80);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-0xb] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 8),local_4d40);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 8),local_4c40);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-10] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x10),local_4d00
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 0x10),local_4c00
                                );
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-9] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x18),local_4cc0
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 0x18),local_4bc0
                                );
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-8] + local_6e20.m_cols * 8) = auVar82;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar71) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < lVar75)) || (uVar69 < uVar57))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = uVar69 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72),local_4e80);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72),
                                 local_4c80);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-7] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 8),local_4e40);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 8),
                                 local_4c40);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-6] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x10),local_4e00
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 0x10),
                                 local_4c00);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-5] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x18),local_4dc0
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 0x18),
                                 local_4bc0);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-4] + local_6e20.m_cols * 8) = auVar82;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar71) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < (long)uVar1)) || (uVar69 < uVar57))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = uVar69 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72),local_4e80);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72),
                                 local_4d80);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-3] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 8),local_4e40);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 8),
                                 local_4d40);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-2] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 0x10),local_4e00
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 0x10),
                                 local_4d00);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-1] + local_6e20.m_cols * 8) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 0x18),local_4dc0
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 0x18),
                                 local_4cc0);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(*pauVar66 + local_6e20.m_cols * 8) = auVar82;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar71) ||
            (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, lVar72 < (long)uVar57)) ||
           ((ulong)local_6e20.m_rows <= lVar65 + 2U)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = lVar72 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])((long)pdVar58 + lVar72 * 8 + local_6dc8),
                                 local_4b80);
        *(undefined1 (*) [64])(pauVar66[-0x17] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6dc8 + 0x40),local_4b40);
        *(undefined1 (*) [64])(pauVar66[-0x16] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6dc8 + 0x80),local_4b00);
        *(undefined1 (*) [64])(pauVar66[-0x15] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6dc8 + 0xc0),local_4ac0);
        *(undefined1 (*) [64])(pauVar66[-0x14] + lVar56) = auVar82;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar71) ||
           (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar72 < (long)uVar1)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = lVar72 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6840._0_8_),local_4a80);
        *(undefined1 (*) [64])(pauVar66[-0x13] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6840._0_8_ + 0x40),local_4a40)
        ;
        *(undefined1 (*) [64])(pauVar66[-0x12] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6840._0_8_ + 0x80),local_4a00)
        ;
        *(undefined1 (*) [64])(pauVar66[-0x11] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])
                                  ((long)pdVar58 + lVar72 * 8 + local_6840._0_8_ + 0xc0),local_49c0)
        ;
        *(undefined1 (*) [64])(pauVar66[-0x10] + lVar56) = auVar82;
        if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
             .m_rows <= lVar71) ||
           (lVar72 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_cols, lVar72 < lVar75)) goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = lVar72 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72),local_4980);
        *(undefined1 (*) [64])(pauVar66[-0xf] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 8),local_4940);
        *(undefined1 (*) [64])(pauVar66[-0xe] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x10),local_4900
                                );
        *(undefined1 (*) [64])(pauVar66[-0xd] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x18),local_48c0
                                );
        *(undefined1 (*) [64])(pauVar66[-0xc] + lVar56) = auVar82;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar71) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < lVar75)) || (uVar69 < uVar1))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = uVar69 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72),local_4a80);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72),local_4980);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-0xb] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 8),local_4a40);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 8),local_4940);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-10] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x10),local_4a00
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 0x10),local_4900
                                );
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-9] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x18),local_49c0
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 0x18),local_48c0
                                );
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-8] + lVar56) = auVar82;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar71) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < lVar75)) || (uVar69 < uVar57))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = uVar69 * lVar71;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72),local_4b80);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72),
                                 local_4980);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-7] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 8),local_4b40);
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 8),
                                 local_4940);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-6] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x10),local_4b00
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 0x10),
                                 local_4900);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-5] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar74 + lVar72 + 0x18),local_4ac0
                                );
        auVar78 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 0x18),
                                 local_48c0);
        auVar82 = vaddpd_avx512f(auVar82,auVar78);
        *(undefined1 (*) [64])(pauVar66[-4] + lVar56) = auVar82;
        if ((((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar71) ||
            (uVar69 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols, (long)uVar69 < (long)uVar1)) || (uVar69 < uVar57))
        goto LAB_007739e8;
        pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_data;
        lVar72 = uVar69 * lVar71;
        lVar65 = lVar65 + 3;
        lVar71 = lVar71 + 1;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72),local_4b80);
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72),
                                 local_4a80);
        auVar82 = vaddpd_avx512f(auVar82,auVar80);
        *(undefined1 (*) [64])(pauVar66[-3] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 8),local_4b40);
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 8),
                                 local_4a40);
        auVar82 = vaddpd_avx512f(auVar82,auVar80);
        *(undefined1 (*) [64])(pauVar66[-2] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 0x10),local_4b00
                                );
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 0x10),
                                 local_4a00);
        auVar82 = vaddpd_avx512f(auVar82,auVar80);
        *(undefined1 (*) [64])(pauVar66[-1] + lVar56) = auVar82;
        auVar82 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + lVar76 + lVar72 + 0x18),local_4ac0
                                );
        auVar80 = vmulpd_avx512f(*(undefined1 (*) [64])(pdVar58 + local_6980._0_8_ + lVar72 + 0x18),
                                 local_49c0);
        auVar82 = vaddpd_avx512f(auVar82,auVar80);
        *(undefined1 (*) [64])(*pauVar66 + lVar56) = auVar82;
        pauVar66 = (undefined1 (*) [64])(*pauVar66 + local_6e20.m_cols * 0x18);
      } while (lVar65 != 0x30);
      pLVar63 = (this->m_layers).
                super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar56 = *(long *)((long)&(pLVar63->m_material).
                                super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + local_6b00._0_8_);
      this_00 = *(ChElementShellANCF_3443 **)
                 ((long)&(pLVar63->m_material).
                         super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount + local_6b00._0_8_);
      if (this_00 == (ChElementShellANCF_3443 *)0x0) {
        this_00 = (ChElementShellANCF_3443 *)local_6c20;
        memcpy(this_00,(void *)(lVar56 + 0x20),0x120);
        dst = local_6de0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pCVar2 = &(this_00->super_ChElementShell).super_ChElementGeneric.Kmatr;
          *(int *)&(pCVar2->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar2->super_ChKblock)._vptr_ChKblock + 1;
          UNLOCK();
        }
        else {
          pCVar2 = &(this_00->super_ChElementShell).super_ChElementGeneric.Kmatr;
          *(int *)&(pCVar2->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar2->super_ChKblock)._vptr_ChKblock + 1;
        }
        memcpy(local_6c20,(void *)(lVar56 + 0x20),0x120);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        pLVar63 = (this->m_layers).
                  super__Vector_base<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      RotateReorderStiffnessMatrix
                (this_00,(ChMatrixNM<double,_6,_6> *)local_6c20,
                 *(double *)((long)&pLVar63->m_theta + local_6b00._0_8_));
      local_6e00.m_cols = 0;
      local_6e00.m_data = (double *)0x0;
      local_6e00.m_rows = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_6e00,0x2400,0x30,0xc0);
      auVar78 = local_6940;
      auVar80 = _local_6ac0;
      auVar82 = _local_6d80;
      if ((((((local_6e20.m_rows < 0x30) || (local_6e20.m_cols < 0x20)) ||
            ((ulong)local_6e20.m_cols < 0x40)) ||
           (((ulong)local_6e20.m_cols < 0x60 || ((ulong)local_6e20.m_cols < 0x80)))) ||
          ((ulong)local_6e20.m_cols < 0xa0)) || ((ulong)local_6e20.m_cols < 0xc0)) {
LAB_00773a21:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 48, 32>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 48, BlockCols = 32, InnerPanel = false]"
        ;
        goto LAB_00773a14;
      }
      local_6d80._0_8_ = local_6e00.m_data;
      local_6d80._0_24_ = CONCAT816(&local_6e00,local_6d80._0_16_);
      _local_6d80 = ZEXT2440(local_6d80._0_24_);
      auStack_6d50 = auVar82._48_16_;
      uStack_6d58 = local_6e00.m_cols;
      if ((local_6e00.m_rows < 0x30) || (local_6e00.m_cols < 0x20)) goto LAB_00773a21;
      pMStack_3350 = (Matrix<double,_16,_6,_1,_16,_6> *)local_6c20._0_8_;
      local_3340 = local_6e20.m_data;
      pdStack_3310 = local_6e20.m_data + 0x20;
      pdStack_32e0 = local_6e20.m_data + 0x40;
      pdStack_32b0 = local_6e20.m_data + 0x60;
      local_3280 = local_6e20.m_data + 0x80;
      pdStack_3250 = local_6e20.m_data + 0xa0;
      uStack_3330 = local_6e20.m_cols;
      psStack_3320 = (pointer)local_6c20._8_8_;
      local_6940._0_8_ = local_6e00.m_data;
      auVar82 = local_6940;
      lVar56 = 0;
      local_6940._24_40_ = auVar78._24_40_;
      local_6940._0_16_ = auVar82._0_16_;
      local_6940._16_8_ = local_6e00.m_cols;
      local_3300 = local_6e20.m_cols;
      psStack_32f0 = (pointer)local_6c20._16_8_;
      uStack_32d0 = local_6e20.m_cols;
      local_32c0 = (ChLoadableUV)local_6c20._24_8_;
      uStack_32a0 = local_6e20.m_cols;
      CStack_3290 = (ChLoadableUVW)local_6c20._32_8_;
      uStack_3270 = local_6e20.m_cols;
      pLStack_3260 = (pointer)local_6c20._40_8_;
      local_3240 = local_6e20.m_cols;
      local_6ac0._8_8_ = local_3380;
      local_6ac0._0_8_ = local_6940;
      puStack_6ab0 = local_6800;
      auStack_6aa0 = auVar80._32_32_;
      pDStack_6aa8 = (DstXprType *)local_6d80;
      do {
        Eigen::internal::copy_using_evaluator_innervec_InnerUnrolling<$75f8c121$>::run
                  ((generic_dense_assignment_kernel<_4484d1d6_> *)local_6ac0,lVar56);
        auVar78 = local_6940;
        auVar80 = _local_6ac0;
        auVar82 = _local_6d80;
        lVar56 = lVar56 + 1;
      } while (lVar56 != 0x30);
      if ((((local_6e20.m_rows < 0x30) || (local_6e20.m_cols < 0x20)) ||
          ((ulong)local_6e20.m_cols < 0x40)) ||
         ((((ulong)local_6e20.m_cols < 0x60 || ((ulong)local_6e20.m_cols < 0x80)) ||
          (((ulong)local_6e20.m_cols < 0xa0 || ((ulong)local_6e20.m_cols < 0xc0))))))
      goto LAB_00773a21;
      local_6d80._0_8_ = local_6e00.m_data + 0x20;
      local_6d80._16_8_ = &local_6e00;
      local_6d80._24_8_ = 0;
      uStack_6d60 = 0x20;
      auStack_6d50 = auVar82._48_16_;
      uStack_6d58 = local_6e00.m_cols;
      if ((local_6e00.m_rows < 0x30) || (local_6e00.m_cols < 0x40)) goto LAB_00773a21;
      pMStack_3350 = (Matrix<double,_16,_6,_1,_16,_6> *)local_6c20._48_8_;
      local_3340 = local_6e20.m_data;
      pdStack_3310 = local_6e20.m_data + 0x20;
      pdStack_32e0 = local_6e20.m_data + 0x40;
      pdStack_32b0 = local_6e20.m_data + 0x60;
      local_3280 = local_6e20.m_data + 0x80;
      pdStack_3250 = local_6e20.m_data + 0xa0;
      uStack_3330 = local_6e20.m_cols;
      psStack_3320 = (pointer)local_6c20._56_8_;
      local_6940._0_8_ = local_6e00.m_data + 0x20;
      auVar82 = local_6940;
      lVar56 = 0;
      local_6940._24_40_ = auVar78._24_40_;
      local_6940._0_16_ = auVar82._0_16_;
      local_6940._16_8_ = local_6e00.m_cols;
      local_3300 = local_6e20.m_cols;
      psStack_32f0 = (pointer)local_6c20._64_8_;
      uStack_32d0 = local_6e20.m_cols;
      local_32c0 = (ChLoadableUV)local_6c20._72_8_;
      uStack_32a0 = local_6e20.m_cols;
      CStack_3290 = (ChLoadableUVW)local_6c20._80_8_;
      uStack_3270 = local_6e20.m_cols;
      pLStack_3260 = (pointer)local_6c20._88_8_;
      local_3240 = local_6e20.m_cols;
      local_6ac0._0_8_ = local_6940;
      puStack_6ab0 = local_6800;
      auStack_6aa0 = auVar80._32_32_;
      pDStack_6aa8 = (DstXprType *)local_6d80;
      do {
        Eigen::internal::copy_using_evaluator_innervec_InnerUnrolling<$75f8c121$>::run
                  ((generic_dense_assignment_kernel<_4484d1d6_> *)local_6ac0,lVar56);
        auVar78 = local_6940;
        auVar80 = _local_6ac0;
        auVar82 = _local_6d80;
        lVar56 = lVar56 + 1;
      } while (lVar56 != 0x30);
      if ((((local_6e20.m_rows < 0x30) || (local_6e20.m_cols < 0x20)) ||
          ((ulong)local_6e20.m_cols < 0x40)) ||
         ((((ulong)local_6e20.m_cols < 0x60 || ((ulong)local_6e20.m_cols < 0x80)) ||
          (((ulong)local_6e20.m_cols < 0xa0 || ((ulong)local_6e20.m_cols < 0xc0))))))
      goto LAB_00773a21;
      local_6d80._0_8_ = local_6e00.m_data + 0x40;
      local_6d80._24_8_ = 0;
      uStack_6d60 = 0x40;
      auStack_6d50 = auVar82._48_16_;
      uStack_6d58 = local_6e00.m_cols;
      if ((local_6e00.m_rows < 0x30) || (local_6e00.m_cols < 0x60)) goto LAB_00773a21;
      pMStack_3350 = local_6bc0;
      local_3340 = local_6e20.m_data;
      pdStack_3310 = local_6e20.m_data + 0x20;
      pdStack_32e0 = local_6e20.m_data + 0x40;
      pdStack_32b0 = local_6e20.m_data + 0x60;
      local_3280 = local_6e20.m_data + 0x80;
      pdStack_3250 = local_6e20.m_data + 0xa0;
      uStack_3330 = local_6e20.m_cols;
      psStack_3320 = local_6bb8;
      local_6940._0_8_ = local_6e00.m_data + 0x40;
      auVar82 = local_6940;
      lVar56 = 0;
      local_6940._24_40_ = auVar78._24_40_;
      local_6940._0_16_ = auVar82._0_16_;
      local_6940._16_8_ = local_6e00.m_cols;
      local_3300 = local_6e20.m_cols;
      psStack_32f0 = local_6bb0;
      uStack_32d0 = local_6e20.m_cols;
      local_32c0 = local_6ba8;
      uStack_32a0 = local_6e20.m_cols;
      CStack_3290 = local_6ba0;
      uStack_3270 = local_6e20.m_cols;
      pLStack_3260 = local_6b98;
      local_3240 = local_6e20.m_cols;
      local_6ac0._0_8_ = local_6940;
      puStack_6ab0 = local_6800;
      auStack_6aa0 = auVar80._32_32_;
      pDStack_6aa8 = (DstXprType *)local_6d80;
      do {
        Eigen::internal::copy_using_evaluator_innervec_InnerUnrolling<$75f8c121$>::run
                  ((generic_dense_assignment_kernel<_4484d1d6_> *)local_6ac0,lVar56);
        auVar78 = local_6940;
        auVar80 = _local_6ac0;
        auVar82 = _local_6d80;
        lVar56 = lVar56 + 1;
      } while (lVar56 != 0x30);
      if (((((local_6e20.m_rows < 0x30) || (local_6e20.m_cols < 0x20)) ||
           ((ulong)local_6e20.m_cols < 0x40)) ||
          (((ulong)local_6e20.m_cols < 0x60 || ((ulong)local_6e20.m_cols < 0x80)))) ||
         (((ulong)local_6e20.m_cols < 0xa0 || ((ulong)local_6e20.m_cols < 0xc0))))
      goto LAB_00773a21;
      local_6d80._0_8_ = local_6e00.m_data + 0x60;
      local_6d80._24_8_ = 0;
      uStack_6d60 = 0x60;
      auStack_6d50 = auVar82._48_16_;
      uStack_6d58 = local_6e00.m_cols;
      if ((local_6e00.m_rows < 0x30) || (local_6e00.m_cols < 0x80)) goto LAB_00773a21;
      pMStack_3350 = local_6b90;
      local_3340 = local_6e20.m_data;
      pdStack_3310 = local_6e20.m_data + 0x20;
      pdStack_32e0 = local_6e20.m_data + 0x40;
      pdStack_32b0 = local_6e20.m_data + 0x60;
      local_3280 = local_6e20.m_data + 0x80;
      pdStack_3250 = local_6e20.m_data + 0xa0;
      uStack_3330 = local_6e20.m_cols;
      psStack_3320 = local_6b88;
      local_6940._0_8_ = local_6e00.m_data + 0x60;
      auVar82 = local_6940;
      lVar56 = 0;
      local_6940._24_40_ = auVar78._24_40_;
      local_6940._0_16_ = auVar82._0_16_;
      local_6940._16_8_ = local_6e00.m_cols;
      local_3300 = local_6e20.m_cols;
      psStack_32f0 = local_6b80;
      uStack_32d0 = local_6e20.m_cols;
      local_32c0 = local_6b78;
      uStack_32a0 = local_6e20.m_cols;
      CStack_3290 = local_6b70;
      uStack_3270 = local_6e20.m_cols;
      pLStack_3260 = local_6b68;
      local_3240 = local_6e20.m_cols;
      local_6ac0._0_8_ = local_6940;
      puStack_6ab0 = local_6800;
      auStack_6aa0 = auVar80._32_32_;
      pDStack_6aa8 = (DstXprType *)local_6d80;
      do {
        Eigen::internal::copy_using_evaluator_innervec_InnerUnrolling<$75f8c121$>::run
                  ((generic_dense_assignment_kernel<_4484d1d6_> *)local_6ac0,lVar56);
        auVar78 = local_6940;
        auVar80 = _local_6ac0;
        auVar82 = _local_6d80;
        lVar56 = lVar56 + 1;
      } while (lVar56 != 0x30);
      if ((((local_6e20.m_rows < 0x30) || (local_6e20.m_cols < 0x20)) ||
          ((ulong)local_6e20.m_cols < 0x40)) ||
         ((((ulong)local_6e20.m_cols < 0x60 || ((ulong)local_6e20.m_cols < 0x80)) ||
          (((ulong)local_6e20.m_cols < 0xa0 || ((ulong)local_6e20.m_cols < 0xc0))))))
      goto LAB_00773a21;
      local_6d80._0_8_ = local_6e00.m_data + 0x80;
      local_6d80._24_8_ = 0;
      uStack_6d60 = 0x80;
      auStack_6d50 = auVar82._48_16_;
      uStack_6d58 = local_6e00.m_cols;
      if ((local_6e00.m_rows < 0x30) || (local_6e00.m_cols < 0xa0)) goto LAB_00773a21;
      pMStack_3350 = local_6b60;
      local_3340 = local_6e20.m_data;
      pdStack_3310 = local_6e20.m_data + 0x20;
      pdStack_32e0 = local_6e20.m_data + 0x40;
      pdStack_32b0 = local_6e20.m_data + 0x60;
      local_3280 = local_6e20.m_data + 0x80;
      pdStack_3250 = local_6e20.m_data + 0xa0;
      uStack_3330 = local_6e20.m_cols;
      psStack_3320 = local_6b58;
      local_6940._0_8_ = local_6e00.m_data + 0x80;
      auVar82 = local_6940;
      lVar56 = 0;
      local_6940._24_40_ = auVar78._24_40_;
      local_6940._0_16_ = auVar82._0_16_;
      local_6940._16_8_ = local_6e00.m_cols;
      local_3300 = local_6e20.m_cols;
      psStack_32f0 = local_6b50;
      uStack_32d0 = local_6e20.m_cols;
      local_32c0 = local_6b48;
      uStack_32a0 = local_6e20.m_cols;
      CStack_3290 = local_6b40;
      uStack_3270 = local_6e20.m_cols;
      pLStack_3260 = local_6b38;
      local_3240 = local_6e20.m_cols;
      local_6ac0._0_8_ = local_6940;
      puStack_6ab0 = local_6800;
      auStack_6aa0 = auVar80._32_32_;
      pDStack_6aa8 = (DstXprType *)local_6d80;
      do {
        Eigen::internal::copy_using_evaluator_innervec_InnerUnrolling<$75f8c121$>::run
                  ((generic_dense_assignment_kernel<_4484d1d6_> *)local_6ac0,lVar56);
        auVar78 = local_6940;
        auVar80 = _local_6ac0;
        auVar82 = _local_6d80;
        lVar56 = lVar56 + 1;
      } while (lVar56 != 0x30);
      if ((((local_6e20.m_rows < 0x30) || (local_6e20.m_cols < 0x20)) ||
          ((ulong)local_6e20.m_cols < 0x40)) ||
         ((((ulong)local_6e20.m_cols < 0x60 || ((ulong)local_6e20.m_cols < 0x80)) ||
          (((ulong)local_6e20.m_cols < 0xa0 || ((ulong)local_6e20.m_cols < 0xc0))))))
      goto LAB_00773a21;
      local_6d80._0_8_ = local_6e00.m_data + 0xa0;
      local_6d80._24_8_ = 0;
      uStack_6d60 = 0xa0;
      auStack_6d50 = auVar82._48_16_;
      uStack_6d58 = local_6e00.m_cols;
      if ((local_6e00.m_rows < 0x30) || (local_6e00.m_cols < 0xc0)) goto LAB_00773a21;
      pMStack_3350 = local_6b30;
      local_3340 = local_6e20.m_data;
      pdStack_3310 = local_6e20.m_data + 0x20;
      pdStack_32e0 = local_6e20.m_data + 0x40;
      pdStack_32b0 = local_6e20.m_data + 0x60;
      local_3280 = local_6e20.m_data + 0x80;
      pdStack_3250 = local_6e20.m_data + 0xa0;
      uStack_3330 = local_6e20.m_cols;
      psStack_3320 = local_6b28;
      local_6940._0_8_ = local_6e00.m_data + 0xa0;
      auVar82 = local_6940;
      local_6940._24_40_ = auVar78._24_40_;
      local_6940._0_16_ = auVar82._0_16_;
      local_6940._16_8_ = local_6e00.m_cols;
      lVar56 = 0;
      local_3300 = local_6e20.m_cols;
      psStack_32f0 = local_6b20;
      uStack_32d0 = local_6e20.m_cols;
      local_32c0 = local_6b18;
      uStack_32a0 = local_6e20.m_cols;
      CStack_3290 = local_6b10;
      uStack_3270 = local_6e20.m_cols;
      pLStack_3260 = local_6b08;
      local_3240 = local_6e20.m_cols;
      local_6ac0._0_8_ = local_6940;
      uVar55 = local_6700._0_8_;
      puStack_6ab0 = local_6800;
      auStack_6aa0 = auVar80._32_32_;
      pDStack_6aa8 = (DstXprType *)local_6d80;
      do {
        Eigen::internal::copy_using_evaluator_innervec_InnerUnrolling<$75f8c121$>::run
                  ((generic_dense_assignment_kernel<_4484d1d6_> *)local_6ac0,lVar56);
        lVar56 = lVar56 + 1;
      } while (lVar56 != 0x30);
      if (local_6dc0.m_cols != local_6e00.m_cols) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Option = 0]"
                     );
      }
      local_3380 = (undefined1  [8])&local_6dc0;
      TStack_3378.m_matrix = (non_const_type)&local_6e00;
      if (((dst->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value != local_6dc0.m_rows) ||
         ((dst->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value != local_6e00.m_rows)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,
                      "static void Eigen::internal::Assignment<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::internal::add_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, SrcXprType = Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
                     );
      }
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::addTo<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>>
                (dst,(Matrix<double,__1,__1,_1,__1,__1> *)&local_6dc0,&TStack_3378);
      auVar80._8_8_ = local_6380._8_8_;
      auVar80._0_8_ = local_6380._0_8_;
      auVar80._16_8_ = local_6380._16_8_;
      auVar80._24_40_ = local_6380._24_40_;
      TStack_3378.m_matrix = (non_const_type)local_6d80;
      auVar82 = vmulpd_avx512f(auVar80,local_5a80);
      auVar78 = vmulpd_avx512f(local_6080,local_5780);
      auVar79 = vmulpd_avx512f(local_5d80,local_5480);
      auVar81 = vmulpd_avx512f(local_6340,local_5a40);
      auVar83 = vmulpd_avx512f(local_6300,local_5a00);
      auVar84 = vmulpd_avx512f(local_5fc0,local_56c0);
      auVar85 = vmulpd_avx512f(local_5cc0,local_53c0);
      auVar80 = vmulpd_avx512f(auVar80,auVar80);
      auVar86 = vmulpd_avx512f(local_6080,local_6080);
      auVar87 = vmulpd_avx512f(local_6340,local_6340);
      auVar88 = vmulpd_avx512f(local_6300,local_6300);
      auVar82 = vaddpd_avx512f(auVar82,auVar78);
      auVar80 = vaddpd_avx512f(auVar80,auVar86);
      auVar78 = vmulpd_avx512f(local_5d80,local_5d80);
      auVar86 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
      _local_6d80 = vaddpd_avx512f(auVar82,auVar79);
      auVar82 = vaddpd_avx512f(auVar80,auVar78);
      auVar80 = vmulpd_avx512f(local_6040,local_5740);
      auVar82 = vaddpd_avx512f(auVar82,auVar86);
      auVar78 = vmulpd_avx512f(local_6040,local_6040);
      auVar80 = vaddpd_avx512f(auVar81,auVar80);
      auVar79 = vmulpd_avx512f(local_5d40,local_5440);
      auVar78 = vaddpd_avx512f(auVar87,auVar78);
      auVar81 = vmulpd_avx512f(local_5d40,local_5d40);
      auVar78 = vaddpd_avx512f(auVar78,auVar81);
      auVar78 = vaddpd_avx512f(auVar78,auVar86);
      local_6d40 = vaddpd_avx512f(auVar80,auVar79);
      auVar80 = vmulpd_avx512f(local_6000,local_5700);
      auVar79 = vmulpd_avx512f(local_6000,local_6000);
      auVar80 = vaddpd_avx512f(auVar83,auVar80);
      auVar81 = vmulpd_avx512f(local_5d00,local_5400);
      auVar79 = vaddpd_avx512f(auVar88,auVar79);
      auVar83 = vmulpd_avx512f(local_5d00,local_5d00);
      auVar79 = vaddpd_avx512f(auVar79,auVar83);
      auVar83 = vmulpd_avx512f(local_5fc0,local_5fc0);
      auVar79 = vaddpd_avx512f(auVar79,auVar86);
      local_6d00 = vaddpd_avx512f(auVar80,auVar81);
      auVar80 = vmulpd_avx512f(local_62c0,local_59c0);
      auVar81 = vmulpd_avx512f(local_62c0,local_62c0);
      auVar81 = vaddpd_avx512f(auVar81,auVar83);
      auVar83 = vmulpd_avx512f(local_5cc0,local_5cc0);
      auVar81 = vaddpd_avx512f(auVar81,auVar83);
      auVar83 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
      auVar80 = vaddpd_avx512f(auVar80,auVar84);
      auVar81 = vaddpd_avx512f(auVar81,auVar86);
      local_6cc0 = vaddpd_avx512f(auVar80,auVar85);
      auVar82 = vmulpd_avx512f(auVar82,auVar83);
      auVar80 = vmulpd_avx512f(auVar78,auVar83);
      auVar78 = vmulpd_avx512f(auVar79,auVar83);
      auVar79 = vmulpd_avx512f(auVar81,auVar83);
      local_3380 = (undefined1  [8])this->m_Alpha;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_3380;
      auVar81 = vbroadcastsd_avx512f(auVar8);
      auVar83 = vmulpd_avx512f(auVar81,_local_6d80);
      _local_6ac0 = vaddpd_avx512f(auVar82,auVar83);
      auVar82 = vmulpd_avx512f(auVar81,local_6d40);
      local_6a80 = vaddpd_avx512f(auVar80,auVar82);
      auVar82 = vmulpd_avx512f(auVar81,local_6d00);
      local_6a40 = vaddpd_avx512f(auVar78,auVar82);
      auVar82 = vmulpd_avx512f(auVar81,local_6cc0);
      local_6a00 = vaddpd_avx512f(auVar79,auVar82);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < (long)uVar55) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) {
LAB_00773a38:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 32, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_00773a14;
      }
      pdVar58 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      auVar82 = vmulpd_avx512f(local_5c80,local_5380);
      auVar80 = vmulpd_avx512f(local_5f00,local_5600);
      auVar78 = vmulpd_avx512f(local_5c00,local_5300);
      auVar79 = vmulpd_avx512f(local_5ec0,local_55c0);
      auVar81 = vmulpd_avx512f(local_5bc0,local_52c0);
      _local_6ac0 = vmulpd_avx512f(_local_6ac0,*(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_));
      local_6a80 = vmulpd_avx512f(local_6a80,*(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 8))
      ;
      auVar83 = vmulpd_avx512f(local_6240,local_5940);
      auVar84 = vmulpd_avx512f(local_6240,local_6240);
      local_6a40 = vmulpd_avx512f(local_6a40,
                                  *(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 0x10));
      auVar85 = vmulpd_avx512f(local_6280,local_5980);
      local_6a00 = vmulpd_avx512f(local_6a00,
                                  *(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 0x18));
      TStack_3378.m_matrix = (non_const_type)local_6d80;
      auVar86 = vmulpd_avx512f(local_5f80,local_5680);
      auVar87 = vmulpd_avx512f(local_5f80,local_5f80);
      auVar88 = vmulpd_avx512f(local_6280,local_6280);
      auVar85 = vaddpd_avx512f(auVar85,auVar86);
      auVar86 = vmulpd_avx512f(local_5ec0,local_5ec0);
      auVar87 = vaddpd_avx512f(auVar88,auVar87);
      auVar88 = vmulpd_avx512f(local_5c80,local_5c80);
      _local_6d80 = vaddpd_avx512f(auVar85,auVar82);
      auVar82 = vmulpd_avx512f(local_5f40,local_5640);
      auVar85 = vaddpd_avx512f(auVar87,auVar88);
      auVar87 = vmulpd_avx512f(local_5f40,local_5f40);
      auVar88 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
      auVar82 = vaddpd_avx512f(auVar83,auVar82);
      auVar83 = vmulpd_avx512f(local_5c40,local_5340);
      auVar84 = vaddpd_avx512f(auVar84,auVar87);
      auVar87 = vmulpd_avx512f(local_5c40,local_5c40);
      auVar84 = vaddpd_avx512f(auVar84,auVar87);
      auVar87 = vmulpd_avx512f(local_5f00,local_5f00);
      auVar85 = vaddpd_avx512f(auVar85,auVar88);
      auVar84 = vaddpd_avx512f(auVar84,auVar88);
      local_6d40 = vaddpd_avx512f(auVar82,auVar83);
      auVar82 = vmulpd_avx512f(local_6200,local_5900);
      auVar83 = vmulpd_avx512f(local_6200,local_6200);
      auVar83 = vaddpd_avx512f(auVar83,auVar87);
      auVar87 = vmulpd_avx512f(local_5c00,local_5c00);
      auVar83 = vaddpd_avx512f(auVar83,auVar87);
      auVar87 = vmulpd_avx512f(local_61c0,local_61c0);
      auVar82 = vaddpd_avx512f(auVar82,auVar80);
      auVar80 = vaddpd_avx512f(auVar87,auVar86);
      auVar86 = vmulpd_avx512f(local_5bc0,local_5bc0);
      auVar83 = vaddpd_avx512f(auVar83,auVar88);
      local_6d00 = vaddpd_avx512f(auVar82,auVar78);
      auVar82 = vmulpd_avx512f(local_61c0,local_58c0);
      auVar80 = vaddpd_avx512f(auVar80,auVar86);
      auVar78 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
      auVar80 = vaddpd_avx512f(auVar80,auVar88);
      auVar82 = vaddpd_avx512f(auVar82,auVar79);
      auVar79 = vmulpd_avx512f(auVar85,auVar78);
      auVar84 = vmulpd_avx512f(auVar84,auVar78);
      auVar83 = vmulpd_avx512f(auVar83,auVar78);
      auVar80 = vmulpd_avx512f(auVar80,auVar78);
      local_6cc0 = vaddpd_avx512f(auVar82,auVar81);
      local_3380 = (undefined1  [8])this->m_Alpha;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_3380;
      auVar82 = vbroadcastsd_avx512f(auVar9);
      auVar78 = vmulpd_avx512f(auVar82,_local_6d80);
      local_6940 = vaddpd_avx512f(auVar79,auVar78);
      auVar78 = vmulpd_avx512f(auVar82,local_6d40);
      local_6900 = vaddpd_avx512f(auVar84,auVar78);
      auVar78 = vmulpd_avx512f(auVar82,local_6d00);
      auVar82 = vmulpd_avx512f(auVar82,local_6cc0);
      local_6880 = vaddpd_avx512f(auVar80,auVar82);
      local_68c0 = vaddpd_avx512f(auVar83,auVar78);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < (long)uVar55) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_00773a38;
      pdVar58 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      local_6940 = vmulpd_avx512f(local_6940,*(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_));
      local_6900 = vmulpd_avx512f(local_6900,*(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 8))
      ;
      auVar82 = vmulpd_avx512f(local_5e80,local_5580);
      auVar80 = vmulpd_avx512f(local_5e80,local_5e80);
      local_68c0 = vmulpd_avx512f(local_68c0,
                                  *(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 0x10));
      auVar78 = vmulpd_avx512f(local_6140,local_5840);
      auVar79 = vmulpd_avx512f(local_6140,local_6140);
      local_6880 = vmulpd_avx512f(local_6880,
                                  *(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 0x18));
      auVar81 = vmulpd_avx512f(local_6180,local_5880);
      auVar83 = vmulpd_avx512f(local_6180,local_6180);
      TStack_3378.m_matrix = (non_const_type)local_6d80;
      auVar80 = vaddpd_avx512f(auVar83,auVar80);
      auVar83 = vmulpd_avx512f(local_5b80,local_5b80);
      auVar80 = vaddpd_avx512f(auVar80,auVar83);
      auVar83 = vmulpd_avx512f(local_5e40,local_5e40);
      auVar79 = vaddpd_avx512f(auVar79,auVar83);
      auVar83 = vmulpd_avx512f(local_5b40,local_5b40);
      auVar82 = vaddpd_avx512f(auVar81,auVar82);
      auVar81 = vmulpd_avx512f(local_5b80,local_5280);
      auVar84 = vmulpd_avx512f(local_5e40,local_5540);
      auVar85 = vmulpd_avx512f(local_5e00,local_5e00);
      auVar86 = vmulpd_avx512f(local_5dc0,local_5dc0);
      auVar79 = vaddpd_avx512f(auVar79,auVar83);
      auVar83 = vmulpd_avx512f(local_6100,local_6100);
      auVar83 = vaddpd_avx512f(auVar83,auVar85);
      auVar85 = vmulpd_avx512f(local_5b00,local_5b00);
      auVar83 = vaddpd_avx512f(auVar83,auVar85);
      _local_6d80 = vaddpd_avx512f(auVar82,auVar81);
      auVar82 = vmulpd_avx512f(local_6100,local_5800);
      auVar78 = vaddpd_avx512f(auVar78,auVar84);
      auVar81 = vmulpd_avx512f(local_5b40,local_5240);
      auVar84 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
      auVar80 = vaddpd_avx512f(auVar80,auVar84);
      auVar79 = vaddpd_avx512f(auVar79,auVar84);
      auVar83 = vaddpd_avx512f(auVar83,auVar84);
      local_6d40 = vaddpd_avx512f(auVar78,auVar81);
      auVar78 = vmulpd_avx512f(local_5e00,local_5500);
      auVar82 = vaddpd_avx512f(auVar82,auVar78);
      auVar78 = vmulpd_avx512f(local_5b00,local_5200);
      auVar81 = vmulpd_avx512f(local_5dc0,local_54c0);
      local_6d00 = vaddpd_avx512f(auVar82,auVar78);
      auVar82 = vmulpd_avx512f(local_60c0,local_60c0);
      auVar78 = vmulpd_avx512f(local_60c0,local_57c0);
      auVar82 = vaddpd_avx512f(auVar82,auVar86);
      auVar78 = vaddpd_avx512f(auVar78,auVar81);
      auVar81 = vmulpd_avx512f(local_5ac0,local_51c0);
      auVar85 = vmulpd_avx512f(local_5ac0,local_5ac0);
      auVar82 = vaddpd_avx512f(auVar82,auVar85);
      auVar85 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
      local_6cc0 = vaddpd_avx512f(auVar78,auVar81);
      auVar82 = vaddpd_avx512f(auVar82,auVar84);
      auVar80 = vmulpd_avx512f(auVar80,auVar85);
      auVar78 = vmulpd_avx512f(auVar79,auVar85);
      auVar79 = vmulpd_avx512f(auVar83,auVar85);
      auVar82 = vmulpd_avx512f(auVar82,auVar85);
      local_3380 = (undefined1  [8])this->m_Alpha;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_3380;
      auVar81 = vbroadcastsd_avx512f(auVar10);
      auVar83 = vmulpd_avx512f(auVar81,_local_6d80);
      local_6800 = vaddpd_avx512f(auVar80,auVar83);
      auVar80 = vmulpd_avx512f(auVar81,local_6d40);
      local_67c0 = vaddpd_avx512f(auVar78,auVar80);
      auVar80 = vmulpd_avx512f(auVar81,local_6d00);
      auVar78 = vmulpd_avx512f(auVar81,local_6cc0);
      local_6740 = vaddpd_avx512f(auVar82,auVar78);
      local_6780 = vaddpd_avx512f(auVar79,auVar80);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < (long)uVar55) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_00773a38;
      pdVar58 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      auVar82 = vmulpd_avx512f(local_5e00,local_5600);
      auVar80 = vmulpd_avx512f(local_5b00,local_5300);
      auVar78 = vmulpd_avx512f(local_60c0,local_58c0);
      auVar79 = vmulpd_avx512f(local_6140,local_5940);
      auVar81 = vmulpd_avx512f(local_5e40,local_5640);
      auVar83 = vmulpd_avx512f(local_5b40,local_5340);
      auVar84 = vmulpd_avx512f(local_6100,local_5900);
      auVar85 = vmulpd_avx512f(local_5c40,local_5240);
      local_6800 = vmulpd_avx512f(local_6800,*(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_));
      auVar86 = vmulpd_avx512f(local_5f00,local_5500);
      auVar87 = vmulpd_avx512f(local_5c00,local_5200);
      auVar88 = vmulpd_avx512f(local_5ec0,local_54c0);
      auVar79 = vaddpd_avx512f(auVar79,auVar81);
      auVar82 = vaddpd_avx512f(auVar84,auVar82);
      auVar79 = vaddpd_avx512f(auVar79,auVar83);
      auVar82 = vaddpd_avx512f(auVar82,auVar80);
      local_67c0 = vmulpd_avx512f(local_67c0,*(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 8))
      ;
      auVar80 = vmulpd_avx512f(local_6180,local_5980);
      local_6780 = vmulpd_avx512f(local_6780,
                                  *(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 0x10));
      auVar81 = vmulpd_avx512f(local_5e80,local_5680);
      local_6740 = vmulpd_avx512f(local_6740,
                                  *(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 0x18));
      auVar80 = vaddpd_avx512f(auVar80,auVar81);
      TStack_3378.m_matrix = (non_const_type)local_6d80;
      auVar81 = vmulpd_avx512f(local_5b80,local_5380);
      auVar83 = vmulpd_avx512f(local_6280,local_5880);
      auVar80 = vaddpd_avx512f(auVar80,auVar81);
      auVar80 = vaddpd_avx512f(auVar80,auVar83);
      auVar81 = vmulpd_avx512f(local_5f80,local_5580);
      auVar80 = vaddpd_avx512f(auVar80,auVar81);
      auVar81 = vmulpd_avx512f(local_5c80,local_5280);
      _local_6d80 = vaddpd_avx512f(auVar80,auVar81);
      auVar80 = vmulpd_avx512f(local_6240,local_5840);
      auVar80 = vaddpd_avx512f(auVar79,auVar80);
      auVar79 = vmulpd_avx512f(local_5f40,local_5540);
      auVar80 = vaddpd_avx512f(auVar80,auVar79);
      local_6d40 = vaddpd_avx512f(auVar80,auVar85);
      auVar80 = vmulpd_avx512f(local_6200,local_5800);
      auVar82 = vaddpd_avx512f(auVar82,auVar80);
      auVar82 = vaddpd_avx512f(auVar82,auVar86);
      local_6d00 = vaddpd_avx512f(auVar82,auVar87);
      auVar82 = vmulpd_avx512f(local_5dc0,local_55c0);
      auVar82 = vaddpd_avx512f(auVar78,auVar82);
      auVar80 = vmulpd_avx512f(local_5ac0,local_52c0);
      auVar78 = vmulpd_avx512f(local_6280,local_6180);
      auVar79 = vmulpd_avx512f(local_5bc0,local_51c0);
      auVar82 = vaddpd_avx512f(auVar82,auVar80);
      auVar80 = vmulpd_avx512f(local_61c0,local_57c0);
      auVar82 = vaddpd_avx512f(auVar82,auVar80);
      auVar82 = vaddpd_avx512f(auVar82,auVar88);
      auVar80 = vmulpd_avx512f(local_5f80,local_5e80);
      local_6cc0 = vaddpd_avx512f(auVar82,auVar79);
      auVar82 = vmulpd_avx512f(local_5f40,local_5e40);
      auVar80 = vaddpd_avx512f(auVar78,auVar80);
      auVar78 = vmulpd_avx512f(local_5c80,local_5b80);
      auVar79 = vmulpd_avx512f(local_6200,local_6100);
      auVar80 = vaddpd_avx512f(auVar80,auVar78);
      auVar78 = vmulpd_avx512f(local_6240,local_6140);
      auVar81 = vmulpd_avx512f(local_5c40,local_5b40);
      auVar82 = vaddpd_avx512f(auVar78,auVar82);
      auVar82 = vaddpd_avx512f(auVar82,auVar81);
      auVar78 = vmulpd_avx512f(local_5f00,local_5e00);
      auVar78 = vaddpd_avx512f(auVar79,auVar78);
      auVar79 = vmulpd_avx512f(local_5c00,local_5b00);
      auVar78 = vaddpd_avx512f(auVar78,auVar79);
      auVar79 = vmulpd_avx512f(local_61c0,local_60c0);
      auVar81 = vmulpd_avx512f(local_5ec0,local_5dc0);
      auVar79 = vaddpd_avx512f(auVar79,auVar81);
      auVar81 = vmulpd_avx512f(local_5bc0,local_5ac0);
      auVar79 = vaddpd_avx512f(auVar79,auVar81);
      local_3380 = (undefined1  [8])this->m_Alpha;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_3380;
      auVar81 = vbroadcastsd_avx512f(auVar11);
      auVar83 = vmulpd_avx512f(auVar81,_local_6d80);
      local_6480 = vaddpd_avx512f(auVar80,auVar83);
      auVar80 = vmulpd_avx512f(auVar81,local_6d40);
      local_6440 = vaddpd_avx512f(auVar82,auVar80);
      auVar82 = vmulpd_avx512f(auVar81,local_6d00);
      local_6400 = vaddpd_avx512f(auVar78,auVar82);
      auVar82 = vmulpd_avx512f(auVar81,local_6cc0);
      local_63c0 = vaddpd_avx512f(auVar79,auVar82);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < (long)uVar55) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_00773a38;
      pdVar58 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      auVar82 = vmulpd_avx512f(local_5e00,local_5700);
      auVar80 = vmulpd_avx512f(local_5b00,local_5400);
      auVar78 = vmulpd_avx512f(local_5d80,local_5280);
      auVar79 = vmulpd_avx512f(local_6140,local_5a40);
      auVar81 = vmulpd_avx512f(local_5e40,local_5740);
      auVar83 = vmulpd_avx512f(local_5d40,local_5240);
      auVar84 = vmulpd_avx512f(local_6100,local_5a00);
      auVar86 = vmulpd_avx512f(local_5cc0,local_51c0);
      local_6480 = vmulpd_avx512f(local_6480,*(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_));
      auVar82 = vaddpd_avx512f(auVar84,auVar82);
      auVar82 = vaddpd_avx512f(auVar82,auVar80);
      local_6440 = vmulpd_avx512f(local_6440,*(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 8))
      ;
      auVar85._8_8_ = local_6380._8_8_;
      auVar85._0_8_ = local_6380._0_8_;
      auVar85._16_8_ = local_6380._16_8_;
      auVar85._24_40_ = local_6380._24_40_;
      auVar80 = vmulpd_avx512f(auVar85,local_5880);
      local_6400 = vmulpd_avx512f(local_6400,
                                  *(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 0x10));
      auVar84 = vmulpd_avx512f(local_6180,local_5a80);
      auVar85 = vmulpd_avx512f(auVar85,local_6180);
      local_63c0 = vmulpd_avx512f(local_63c0,
                                  *(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 0x18));
      TStack_3378.m_matrix = (non_const_type)local_6d80;
      auVar87 = vmulpd_avx512f(local_5e80,local_5780);
      auVar88 = vmulpd_avx512f(local_6080,local_5e80);
      auVar89 = vmulpd_avx512f(local_6040,local_5e40);
      auVar84 = vaddpd_avx512f(auVar84,auVar87);
      auVar87 = vmulpd_avx512f(local_5b80,local_5480);
      auVar85 = vaddpd_avx512f(auVar85,auVar88);
      auVar88 = vmulpd_avx512f(local_5d80,local_5b80);
      auVar85 = vaddpd_avx512f(auVar85,auVar88);
      auVar84 = vaddpd_avx512f(auVar84,auVar87);
      auVar80 = vaddpd_avx512f(auVar84,auVar80);
      auVar84 = vmulpd_avx512f(local_6080,local_5580);
      auVar80 = vaddpd_avx512f(auVar80,auVar84);
      _local_6d80 = vaddpd_avx512f(auVar80,auVar78);
      auVar80 = vmulpd_avx512f(local_6340,local_5840);
      auVar78 = vaddpd_avx512f(auVar79,auVar81);
      auVar79 = vmulpd_avx512f(local_5b40,local_5440);
      auVar81 = vmulpd_avx512f(local_6340,local_6140);
      auVar81 = vaddpd_avx512f(auVar81,auVar89);
      auVar84 = vmulpd_avx512f(local_5d40,local_5b40);
      auVar78 = vaddpd_avx512f(auVar78,auVar79);
      auVar79 = vaddpd_avx512f(auVar81,auVar84);
      auVar80 = vaddpd_avx512f(auVar78,auVar80);
      auVar78 = vmulpd_avx512f(local_6040,local_5540);
      auVar80 = vaddpd_avx512f(auVar80,auVar78);
      local_6d40 = vaddpd_avx512f(auVar80,auVar83);
      auVar80 = vmulpd_avx512f(local_6300,local_5800);
      auVar78 = vmulpd_avx512f(local_6300,local_6100);
      auVar82 = vaddpd_avx512f(auVar82,auVar80);
      auVar80 = vmulpd_avx512f(local_6000,local_5500);
      auVar81 = vmulpd_avx512f(local_6000,local_5e00);
      auVar82 = vaddpd_avx512f(auVar82,auVar80);
      auVar80 = vaddpd_avx512f(auVar78,auVar81);
      auVar78 = vmulpd_avx512f(local_5d00,local_5200);
      auVar81 = vmulpd_avx512f(local_5d00,local_5b00);
      local_6d00 = vaddpd_avx512f(auVar82,auVar78);
      auVar82 = vaddpd_avx512f(auVar80,auVar81);
      auVar80 = vmulpd_avx512f(local_60c0,local_59c0);
      auVar78 = vmulpd_avx512f(local_5dc0,local_56c0);
      auVar80 = vaddpd_avx512f(auVar80,auVar78);
      auVar78 = vmulpd_avx512f(local_5ac0,local_53c0);
      auVar80 = vaddpd_avx512f(auVar80,auVar78);
      auVar78 = vmulpd_avx512f(local_62c0,local_57c0);
      auVar81 = vmulpd_avx512f(local_62c0,local_60c0);
      auVar80 = vaddpd_avx512f(auVar80,auVar78);
      auVar78 = vmulpd_avx512f(local_5fc0,local_5dc0);
      auVar83 = vmulpd_avx512f(local_5fc0,local_54c0);
      auVar78 = vaddpd_avx512f(auVar81,auVar78);
      auVar81 = vmulpd_avx512f(local_5cc0,local_5ac0);
      auVar80 = vaddpd_avx512f(auVar80,auVar83);
      local_6cc0 = vaddpd_avx512f(auVar80,auVar86);
      auVar80 = vaddpd_avx512f(auVar78,auVar81);
      local_3380 = (undefined1  [8])this->m_Alpha;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_3380;
      auVar78 = vbroadcastsd_avx512f(auVar12);
      auVar81 = vmulpd_avx512f(auVar78,_local_6d80);
      local_6580 = vaddpd_avx512f(auVar85,auVar81);
      auVar81 = vmulpd_avx512f(auVar78,local_6d40);
      local_6540 = vaddpd_avx512f(auVar79,auVar81);
      auVar79 = vmulpd_avx512f(auVar78,local_6d00);
      local_6500 = vaddpd_avx512f(auVar82,auVar79);
      auVar82 = vmulpd_avx512f(auVar78,local_6cc0);
      local_64c0 = vaddpd_avx512f(auVar80,auVar82);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < (long)uVar55) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_00773a38;
      pdVar58 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      auVar82 = vmulpd_avx512f(local_6000,local_5600);
      auVar80 = vmulpd_avx512f(local_5d00,local_5300);
      auVar78 = vmulpd_avx512f(local_5f40,local_5740);
      auVar79 = vmulpd_avx512f(local_5c40,local_5440);
      auVar81 = vmulpd_avx512f(local_5d40,local_5340);
      auVar83 = vmulpd_avx512f(local_6200,local_5a00);
      auVar84 = vmulpd_avx512f(local_5f00,local_5700);
      auVar85 = vmulpd_avx512f(local_5c00,local_5400);
      local_6580 = vmulpd_avx512f(local_6580,*(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_));
      auVar83 = vaddpd_avx512f(auVar83,auVar84);
      auVar83 = vaddpd_avx512f(auVar83,auVar85);
      local_6540 = vmulpd_avx512f(local_6540,*(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 8))
      ;
      auVar84 = vmulpd_avx512f(local_6280,local_5a80);
      auVar85 = vmulpd_avx512f(local_5bc0,local_53c0);
      local_6500 = vmulpd_avx512f(local_6500,
                                  *(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 0x10));
      auVar86 = vmulpd_avx512f(local_5f80,local_5780);
      local_64c0 = vmulpd_avx512f(local_64c0,
                                  *(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 0x18));
      auVar84 = vaddpd_avx512f(auVar84,auVar86);
      TStack_3378.m_matrix = (non_const_type)local_6d80;
      auVar87 = vmulpd_avx512f(local_5c80,local_5480);
      auVar86._8_8_ = local_6380._8_8_;
      auVar86._0_8_ = local_6380._0_8_;
      auVar86._16_8_ = local_6380._16_8_;
      auVar86._24_40_ = local_6380._24_40_;
      auVar88 = vmulpd_avx512f(auVar86,local_5980);
      auVar84 = vaddpd_avx512f(auVar84,auVar87);
      auVar84 = vaddpd_avx512f(auVar84,auVar88);
      auVar87 = vmulpd_avx512f(local_6080,local_5680);
      auVar84 = vaddpd_avx512f(auVar84,auVar87);
      auVar87 = vmulpd_avx512f(local_5d80,local_5380);
      _local_6d80 = vaddpd_avx512f(auVar84,auVar87);
      auVar84 = vmulpd_avx512f(local_6240,local_5a40);
      auVar87 = vmulpd_avx512f(local_6340,local_5940);
      auVar78 = vaddpd_avx512f(auVar84,auVar78);
      auVar78 = vaddpd_avx512f(auVar78,auVar79);
      auVar78 = vaddpd_avx512f(auVar78,auVar87);
      auVar79 = vmulpd_avx512f(local_6040,local_5640);
      auVar78 = vaddpd_avx512f(auVar78,auVar79);
      local_6d40 = vaddpd_avx512f(auVar78,auVar81);
      auVar78 = vmulpd_avx512f(local_6300,local_5900);
      auVar78 = vaddpd_avx512f(auVar83,auVar78);
      auVar82 = vaddpd_avx512f(auVar78,auVar82);
      auVar78 = vmulpd_avx512f(local_62c0,local_58c0);
      auVar79 = vmulpd_avx512f(local_5fc0,local_55c0);
      auVar81 = vmulpd_avx512f(auVar86,local_6280);
      auVar83 = vmulpd_avx512f(local_6340,local_6240);
      auVar84 = vmulpd_avx512f(local_6300,local_6200);
      local_6d00 = vaddpd_avx512f(auVar82,auVar80);
      auVar82 = vmulpd_avx512f(local_61c0,local_59c0);
      auVar80 = vmulpd_avx512f(local_5ec0,local_5fc0);
      auVar86 = vmulpd_avx512f(local_5ec0,local_56c0);
      auVar87 = vmulpd_avx512f(local_61c0,local_62c0);
      auVar82 = vaddpd_avx512f(auVar82,auVar86);
      auVar82 = vaddpd_avx512f(auVar82,auVar85);
      auVar82 = vaddpd_avx512f(auVar82,auVar78);
      auVar80 = vaddpd_avx512f(auVar87,auVar80);
      auVar82 = vaddpd_avx512f(auVar82,auVar79);
      auVar78 = vmulpd_avx512f(local_5cc0,local_52c0);
      auVar79 = vmulpd_avx512f(local_5cc0,local_5bc0);
      auVar80 = vaddpd_avx512f(auVar80,auVar79);
      local_6cc0 = vaddpd_avx512f(auVar82,auVar78);
      auVar82 = vmulpd_avx512f(local_6080,local_5f80);
      auVar82 = vaddpd_avx512f(auVar81,auVar82);
      auVar78 = vmulpd_avx512f(local_5d80,local_5c80);
      auVar82 = vaddpd_avx512f(auVar82,auVar78);
      auVar78 = vmulpd_avx512f(local_6040,local_5f40);
      auVar78 = vaddpd_avx512f(auVar83,auVar78);
      auVar79 = vmulpd_avx512f(local_5d40,local_5c40);
      auVar78 = vaddpd_avx512f(auVar78,auVar79);
      auVar79 = vmulpd_avx512f(local_5f00,local_6000);
      auVar79 = vaddpd_avx512f(auVar84,auVar79);
      auVar81 = vmulpd_avx512f(local_5c00,local_5d00);
      auVar79 = vaddpd_avx512f(auVar79,auVar81);
      local_3380 = (undefined1  [8])this->m_Alpha;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_3380;
      auVar81 = vbroadcastsd_avx512f(auVar13);
      auVar83 = vmulpd_avx512f(auVar81,_local_6d80);
      local_6680 = vaddpd_avx512f(auVar82,auVar83);
      auVar82 = vmulpd_avx512f(auVar81,local_6d40);
      local_6640 = vaddpd_avx512f(auVar78,auVar82);
      auVar82 = vmulpd_avx512f(auVar81,local_6d00);
      local_6600 = vaddpd_avx512f(auVar79,auVar82);
      auVar82 = vmulpd_avx512f(auVar81,local_6cc0);
      local_65c0 = vaddpd_avx512f(auVar80,auVar82);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < (long)uVar55) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_00773a38;
      pdVar58 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      local_6680 = vmulpd_avx512f(local_6680,*(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_));
      local_6640 = vmulpd_avx512f(local_6640,*(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 8))
      ;
      local_6600 = vmulpd_avx512f(local_6600,
                                  *(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 0x10));
      local_65c0 = vmulpd_avx512f(local_65c0,
                                  *(undefined1 (*) [64])(pdVar58 + local_6b00._0_8_ + 0x18));
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_6c20._32_8_;
      auVar82 = vbroadcastsd_avx512f(auVar14);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_6c20._40_8_;
      auVar80 = vbroadcastsd_avx512f(auVar15);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_6c20._16_8_;
      auVar78 = vbroadcastsd_avx512f(auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_6c20._8_8_;
      auVar79 = vbroadcastsd_avx512f(auVar17);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_6c20._0_8_;
      auVar81 = vbroadcastsd_avx512f(auVar18);
      local_6980 = vmulpd_avx512f(auVar78,local_6800);
      local_66c0 = vmulpd_avx512f(auVar82,local_6580);
      local_6b00 = vmulpd_avx512f(auVar80,local_6680);
      auVar83 = vmulpd_avx512f(auVar79,local_6940);
      auVar84 = vmulpd_avx512f(auVar80,local_65c0);
      auVar85 = vmulpd_avx512f(auVar81,_local_6ac0);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_6c20._24_8_;
      auVar86 = vbroadcastsd_avx512f(auVar19);
      local_6700 = vmulpd_avx512f(auVar81,local_6a80);
      local_4880 = vmulpd_avx512f(auVar79,local_6900);
      local_6840 = vmulpd_avx512f(auVar86,local_6480);
      local_33c0 = vmulpd_avx512f(auVar78,local_67c0);
      local_3400 = vmulpd_avx512f(auVar86,local_6440);
      local_3500 = vmulpd_avx512f(auVar79,local_68c0);
      local_3440 = vmulpd_avx512f(auVar82,local_6540);
      local_3480 = vmulpd_avx512f(auVar80,local_6640);
      local_3540 = vmulpd_avx512f(auVar78,local_6780);
      local_34c0 = vmulpd_avx512f(auVar81,local_6a40);
      local_3680 = vmulpd_avx512f(auVar79,local_6880);
      local_3640 = vmulpd_avx512f(auVar81,local_6a00);
      local_3580 = vmulpd_avx512f(auVar86,local_6400);
      local_36c0 = vmulpd_avx512f(auVar78,local_6740);
      local_3700 = vmulpd_avx512f(auVar86,local_63c0);
      local_35c0 = vmulpd_avx512f(auVar82,local_6500);
      local_3740 = vmulpd_avx512f(auVar82,local_64c0);
      local_3600 = vmulpd_avx512f(auVar80,local_6600);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_6c20._56_8_;
      auVar82 = vbroadcastsd_avx512f(auVar20);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_6c20._64_8_;
      auVar80 = vbroadcastsd_avx512f(auVar21);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_6c20._48_8_;
      auVar78 = vbroadcastsd_avx512f(auVar22);
      local_37c0 = vmulpd_avx512f(auVar82,local_6940);
      local_3780 = vmulpd_avx512f(auVar78,_local_6ac0);
      local_3800 = vmulpd_avx512f(auVar78,local_6a80);
      local_3840 = vmulpd_avx512f(auVar82,local_6900);
      local_3980 = vmulpd_avx512f(auVar82,local_68c0);
      local_3900 = vmulpd_avx512f(auVar82,local_6880);
      local_3880 = vmulpd_avx512f(auVar78,local_6a40);
      local_38c0 = vmulpd_avx512f(auVar78,local_6a00);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_6c20._72_8_;
      auVar82 = vbroadcastsd_avx512f(auVar23);
      local_3b00 = vmulpd_avx512f(auVar80,local_6800);
      local_3a40 = vmulpd_avx512f(auVar80,local_67c0);
      local_3a80 = vmulpd_avx512f(auVar82,local_6400);
      local_3a00 = vmulpd_avx512f(auVar82,local_63c0);
      local_39c0 = vmulpd_avx512f(auVar80,local_6780);
      local_3940 = vmulpd_avx512f(auVar80,local_6740);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_6c20._80_8_;
      auVar80 = vbroadcastsd_avx512f(auVar24);
      local_3ac0 = vmulpd_avx512f(auVar80,local_64c0);
      local_3c00 = vmulpd_avx512f(auVar82,local_6480);
      local_3b40 = vmulpd_avx512f(auVar82,local_6440);
      auVar82 = vmulpd_avx512f(auVar80,local_6580);
      local_3c40 = vmulpd_avx512f(auVar80,local_6540);
      local_3b80 = vmulpd_avx512f(auVar80,local_6500);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_6c20._88_8_;
      auVar80 = vbroadcastsd_avx512f(auVar25);
      auVar78 = vmulpd_avx512f(auVar80,local_6640);
      auVar79 = vmulpd_avx512f(auVar80,local_6600);
      local_3bc0 = vmulpd_avx512f(auVar80,local_65c0);
      auVar81 = vmulpd_avx512f(auVar80,local_6680);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_6bc0;
      auVar80 = vbroadcastsd_avx512f(auVar26);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_6ba8;
      auVar86 = vbroadcastsd_avx512f(auVar27);
      local_3c80 = vmulpd_avx512f(auVar80,_local_6ac0);
      local_3d40 = vmulpd_avx512f(auVar80,local_6a00);
      local_3cc0 = vmulpd_avx512f(auVar80,local_6a80);
      local_3d00 = vmulpd_avx512f(auVar80,local_6a40);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_6bb8;
      auVar80 = vbroadcastsd_avx512f(auVar28);
      local_3f00 = vmulpd_avx512f(auVar80,local_6940);
      local_3e00 = vmulpd_avx512f(auVar80,local_68c0);
      local_3ec0 = vmulpd_avx512f(auVar80,local_6900);
      local_3d80 = vmulpd_avx512f(auVar80,local_6880);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_6bb0;
      auVar80 = vbroadcastsd_avx512f(auVar29);
      local_4100 = vmulpd_avx512f(auVar86,local_6480);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_6ba0;
      auVar87 = vbroadcastsd_avx512f(auVar30);
      local_4000 = vmulpd_avx512f(auVar80,local_6800);
      local_3f40 = vmulpd_avx512f(auVar80,local_67c0);
      auVar88 = vmulpd_avx512f(auVar87,local_6540);
      local_3e40 = vmulpd_avx512f(auVar80,local_6780);
      local_3dc0 = vmulpd_avx512f(auVar80,local_6740);
      local_4040 = vmulpd_avx512f(auVar86,local_6440);
      local_3f80 = vmulpd_avx512f(auVar86,local_6400);
      local_3e80 = vmulpd_avx512f(auVar86,local_63c0);
      local_4080 = vmulpd_avx512f(auVar87,local_6500);
      local_3fc0 = vmulpd_avx512f(auVar87,local_64c0);
      auVar86 = vmulpd_avx512f(auVar87,local_6580);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_6b98;
      auVar80 = vbroadcastsd_avx512f(auVar31);
      local_4140 = vmulpd_avx512f(auVar80,local_6600);
      auVar87 = vmulpd_avx512f(auVar80,local_6640);
      auVar89 = vmulpd_avx512f(auVar80,local_6680);
      local_40c0 = vmulpd_avx512f(auVar80,local_65c0);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_6b78;
      auVar80 = vbroadcastsd_avx512f(auVar32);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_6b90;
      auVar90 = vbroadcastsd_avx512f(auVar33);
      local_4180 = vmulpd_avx512f(auVar90,_local_6ac0);
      local_4240 = vmulpd_avx512f(auVar90,local_6a00);
      local_41c0 = vmulpd_avx512f(auVar90,local_6a80);
      local_4200 = vmulpd_avx512f(auVar90,local_6a40);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_6b88;
      auVar90 = vbroadcastsd_avx512f(auVar34);
      local_4400 = vmulpd_avx512f(auVar90,local_6940);
      local_43c0 = vmulpd_avx512f(auVar90,local_6900);
      local_4300 = vmulpd_avx512f(auVar90,local_68c0);
      local_4280 = vmulpd_avx512f(auVar90,local_6880);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_6b80;
      auVar90 = vbroadcastsd_avx512f(auVar35);
      local_4600 = vmulpd_avx512f(auVar80,local_6480);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_6b70;
      auVar91 = vbroadcastsd_avx512f(auVar36);
      local_4500 = vmulpd_avx512f(auVar90,local_6800);
      local_4440 = vmulpd_avx512f(auVar90,local_67c0);
      auVar92 = vmulpd_avx512f(auVar91,local_6580);
      local_4340 = vmulpd_avx512f(auVar90,local_6780);
      local_42c0 = vmulpd_avx512f(auVar90,local_6740);
      local_4540 = vmulpd_avx512f(auVar80,local_6440);
      local_4480 = vmulpd_avx512f(auVar80,local_6400);
      local_4380 = vmulpd_avx512f(auVar80,local_63c0);
      local_4580 = vmulpd_avx512f(auVar91,local_6500);
      local_4640 = vmulpd_avx512f(auVar91,local_6540);
      local_44c0 = vmulpd_avx512f(auVar91,local_64c0);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_6b68;
      auVar80 = vbroadcastsd_avx512f(auVar37);
      auVar90 = vmulpd_avx512f(auVar80,local_6600);
      auVar91 = vmulpd_avx512f(auVar80,local_6680);
      auVar93 = vmulpd_avx512f(auVar80,local_6640);
      local_45c0 = vmulpd_avx512f(auVar80,local_65c0);
      auVar121._8_8_ = 0;
      auVar121._0_8_ = local_6b38;
      vmovsd_avx512f(auVar121);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_6b60;
      auVar80 = vbroadcastsd_avx512f(auVar38);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_6b58;
      auVar94 = vbroadcastsd_avx512f(auVar39);
      local_4680 = vmulpd_avx512f(auVar80,_local_6ac0);
      local_46c0 = vmulpd_avx512f(auVar80,local_6a80);
      local_4740 = vmulpd_avx512f(auVar80,local_6a00);
      local_4700 = vmulpd_avx512f(auVar80,local_6a40);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_6b48;
      auVar80 = vbroadcastsd_avx512f(auVar40);
      auVar95 = vmulpd_avx512f(auVar80,local_6480);
      auVar96 = vmulpd_avx512f(auVar80,local_6440);
      auVar97 = vmulpd_avx512f(auVar80,local_6400);
      local_4800 = vmulpd_avx512f(auVar94,local_68c0);
      auVar98 = vmulpd_avx512f(auVar94,local_6940);
      auVar99 = vmulpd_avx512f(auVar94,local_6900);
      local_4780 = vmulpd_avx512f(auVar94,local_6880);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_6b50;
      auVar94 = vbroadcastsd_avx512f(auVar41);
      auVar100 = vmulpd_avx512f(auVar94,local_6800);
      auVar101 = vmulpd_avx512f(auVar94,local_6780);
      auVar102 = vmulpd_avx512f(auVar94,local_67c0);
      local_47c0 = vmulpd_avx512f(auVar94,local_6740);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_6b40;
      auVar94 = vbroadcastsd_avx512f(auVar42);
      auVar103 = vmulpd_avx512f(auVar94,local_6580);
      auVar104 = vmulpd_avx512f(auVar94,local_6540);
      auVar105 = vmulpd_avx512f(auVar94,local_6500);
      local_4840 = vmulpd_avx512f(auVar80,local_63c0);
      auVar94 = vmulpd_avx512f(auVar94,local_64c0);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_6b68;
      auVar80 = vbroadcastsd_avx512f(auVar43);
      auVar106 = vmulpd_avx512f(auVar80,local_6640);
      auVar107 = vmulpd_avx512f(auVar80,local_6600);
      auVar108 = vmulpd_avx512f(auVar80,local_65c0);
      auVar109 = vmulpd_avx512f(auVar80,local_6680);
      auVar115._8_8_ = 0;
      auVar115._0_8_ = local_6b30;
      vmovsd_avx512f(auVar115);
      local_3380 = (undefined1  [8])local_6b60;
      TStack_3378.m_matrix = (non_const_type)local_6ac0;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = local_6b28;
      vmovsd_avx512f(auVar116);
      auVar117._8_8_ = 0;
      auVar117._0_8_ = local_6b20;
      vmovsd_avx512f(auVar117);
      auVar118._8_8_ = 0;
      auVar118._0_8_ = local_6b18;
      vmovsd_avx512f(auVar118);
      auVar119._8_8_ = 0;
      auVar119._0_8_ = local_6b10;
      vmovsd_avx512f(auVar119);
      auVar120._8_8_ = 0;
      auVar120._0_8_ = local_6b08;
      vmovsd_avx512f(auVar120);
      dVar51 = (double)(this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       .m_storage.m_cols;
      auVar80 = local_6c80;
      if ((long)dVar51 < (long)local_6c80._0_8_) {
LAB_007739e8:
        local_6c80 = auVar80;
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 32>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 32, InnerPanel = false]"
        ;
        goto LAB_00773a14;
      }
      auVar80 = vaddpd_avx512f(auVar85,auVar83);
      auVar80 = vaddpd_avx512f(auVar80,local_6980);
      auVar83 = vaddpd_avx512f(auVar98,local_4680);
      auVar85 = vaddpd_avx512f(auVar99,local_46c0);
      uVar57 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      pauVar66 = (undefined1 (*) [64])local_30c0;
      uVar69 = 0;
      auVar80 = vaddpd_avx512f(auVar80,local_6840);
      pdVar58 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data + 0x18;
      auVar80 = vaddpd_avx512f(auVar80,local_66c0);
      auVar80 = vaddpd_avx512f(auVar80,local_6b00);
      auVar83 = vaddpd_avx512f(auVar83,auVar100);
      auVar85 = vaddpd_avx512f(auVar85,auVar102);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_6b50;
      auVar98 = vbroadcastsd_avx512f(auVar44);
      auVar99 = vaddpd_avx512f(local_4800,local_4700);
      auVar83 = vaddpd_avx512f(auVar83,auVar95);
      auVar85 = vaddpd_avx512f(auVar85,auVar96);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_6b40;
      auVar95 = vbroadcastsd_avx512f(auVar45);
      auVar83 = vaddpd_avx512f(auVar83,auVar103);
      auVar85 = vaddpd_avx512f(auVar85,auVar104);
      auVar96 = vaddpd_avx512f(local_4880,local_6700);
      auVar83 = vaddpd_avx512f(auVar83,auVar109);
      auVar85 = vaddpd_avx512f(auVar85,auVar106);
      auVar99 = vaddpd_avx512f(auVar99,auVar101);
      auVar96 = vaddpd_avx512f(auVar96,local_33c0);
      auVar97 = vaddpd_avx512f(auVar99,auVar97);
      auVar96 = vaddpd_avx512f(auVar96,local_3400);
      auVar97 = vaddpd_avx512f(auVar97,auVar105);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_6b68;
      auVar99 = vbroadcastsd_avx512f(auVar46);
      auVar96 = vaddpd_avx512f(auVar96,local_3440);
      auVar97 = vaddpd_avx512f(auVar97,auVar107);
      local_6980 = vaddpd_avx512f(auVar96,local_3480);
      auVar96 = vaddpd_avx512f(local_3500,local_34c0);
      auVar96 = vaddpd_avx512f(auVar96,local_3540);
      auVar96 = vaddpd_avx512f(auVar96,local_3580);
      auVar96 = vaddpd_avx512f(auVar96,local_35c0);
      local_6840 = vaddpd_avx512f(auVar96,local_3600);
      auVar96 = vaddpd_avx512f(local_3680,local_3640);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_6b58;
      auVar100 = vbroadcastsd_avx512f(auVar47);
      auVar101 = vmulpd_avx512f(auVar100,local_6900);
      auVar96 = vaddpd_avx512f(auVar96,local_36c0);
      auVar96 = vaddpd_avx512f(auVar96,local_3700);
      auVar96 = vaddpd_avx512f(auVar96,local_3740);
      local_66c0 = vaddpd_avx512f(auVar96,auVar84);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_6b48;
      auVar84 = vbroadcastsd_avx512f(auVar48);
      auVar96 = vaddpd_avx512f(local_37c0,local_3780);
      auVar96 = vaddpd_avx512f(auVar96,local_3b00);
      auVar96 = vaddpd_avx512f(auVar96,local_3c00);
      auVar82 = vaddpd_avx512f(auVar96,auVar82);
      local_6b00 = vaddpd_avx512f(auVar82,auVar81);
      auVar82 = vaddpd_avx512f(local_3840,local_3800);
      auVar81 = vaddpd_avx512f(local_3f00,local_3c80);
      auVar96 = vaddpd_avx512f(local_4780,local_4740);
      auVar102 = vmulpd_avx512f(auVar98,local_6800);
      auVar82 = vaddpd_avx512f(auVar82,local_3a40);
      auVar81 = vaddpd_avx512f(auVar81,local_4000);
      auVar96 = vaddpd_avx512f(auVar96,local_47c0);
      auVar82 = vaddpd_avx512f(auVar82,local_3b40);
      auVar81 = vaddpd_avx512f(auVar81,local_4100);
      auVar96 = vaddpd_avx512f(auVar96,local_4840);
      auVar82 = vaddpd_avx512f(auVar82,local_3c40);
      auVar81 = vaddpd_avx512f(auVar81,auVar86);
      auVar86 = vaddpd_avx512f(auVar96,auVar94);
      local_6700 = vaddpd_avx512f(auVar82,auVar78);
      auVar82 = vaddpd_avx512f(auVar81,auVar89);
      auVar78 = vaddpd_avx512f(auVar86,auVar108);
      auVar81 = vmulpd_avx512f(auVar100,local_68c0);
      auVar86 = vaddpd_avx512f(local_3ec0,local_3cc0);
      auVar89 = vaddpd_avx512f(local_3980,local_3880);
      auVar94 = vaddpd_avx512f(local_3900,local_38c0);
      auVar86 = vaddpd_avx512f(auVar86,local_3f40);
      auVar89 = vaddpd_avx512f(auVar89,local_39c0);
      auVar86 = vaddpd_avx512f(auVar86,local_4040);
      auVar89 = vaddpd_avx512f(auVar89,local_3a80);
      auVar89 = vaddpd_avx512f(auVar89,local_3b80);
      auVar86 = vaddpd_avx512f(auVar86,auVar88);
      auVar88 = vaddpd_avx512f(local_3d80,local_3d40);
      auVar86 = vaddpd_avx512f(auVar86,auVar87);
      auVar87 = vaddpd_avx512f(local_3e00,local_3d00);
      auVar88 = vaddpd_avx512f(auVar88,local_3dc0);
      auVar79 = vaddpd_avx512f(auVar89,auVar79);
      auVar89 = vaddpd_avx512f(auVar94,local_3940);
      auVar94 = vaddpd_avx512f(local_4400,local_4180);
      auVar87 = vaddpd_avx512f(auVar87,local_3e40);
      auVar88 = vaddpd_avx512f(auVar88,local_3e80);
      auVar89 = vaddpd_avx512f(auVar89,local_3a00);
      auVar94 = vaddpd_avx512f(auVar94,local_4500);
      auVar96 = vaddpd_avx512f(local_43c0,local_41c0);
      auVar87 = vaddpd_avx512f(auVar87,local_3f80);
      auVar88 = vaddpd_avx512f(auVar88,local_3fc0);
      auVar89 = vaddpd_avx512f(auVar89,local_3ac0);
      auVar94 = vaddpd_avx512f(auVar94,local_4600);
      auVar87 = vaddpd_avx512f(auVar87,local_4080);
      auVar88 = vaddpd_avx512f(auVar88,local_40c0);
      auVar89 = vaddpd_avx512f(auVar89,local_3bc0);
      auVar87 = vaddpd_avx512f(auVar87,local_4140);
      auVar92 = vaddpd_avx512f(auVar94,auVar92);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_6b60;
      auVar94 = vbroadcastsd_avx512f(auVar49);
      auVar103 = vmulpd_avx512f(auVar94,_local_6ac0);
      auVar91 = vaddpd_avx512f(auVar92,auVar91);
      auVar92 = vaddpd_avx512f(auVar96,local_4440);
      auVar96 = vaddpd_avx512f(local_4300,local_4200);
      auVar92 = vaddpd_avx512f(auVar92,local_4540);
      auVar92 = vaddpd_avx512f(auVar92,local_4640);
      auVar92 = vaddpd_avx512f(auVar92,auVar93);
      auVar93 = vaddpd_avx512f(auVar96,local_4340);
      auVar96 = vaddpd_avx512f(local_4280,local_4240);
      auVar93 = vaddpd_avx512f(auVar93,local_4480);
      auVar93 = vaddpd_avx512f(auVar93,local_4580);
      auVar90 = vaddpd_avx512f(auVar93,auVar90);
      auVar93 = vaddpd_avx512f(auVar96,local_42c0);
      auVar96 = vmulpd_avx512f(auVar100,local_6940);
      auVar93 = vaddpd_avx512f(auVar93,local_4380);
      auVar93 = vaddpd_avx512f(auVar93,local_44c0);
      auVar93 = vaddpd_avx512f(auVar93,local_45c0);
      auVar96 = vaddpd_avx512f(auVar103,auVar96);
      auVar103 = vmulpd_avx512f(auVar84,local_6480);
      auVar96 = vaddpd_avx512f(auVar96,auVar102);
      auVar102 = vmulpd_avx512f(auVar95,local_6580);
      auVar96 = vaddpd_avx512f(auVar96,auVar103);
      auVar103 = vmulpd_avx512f(auVar99,local_6680);
      auVar96 = vaddpd_avx512f(auVar96,auVar102);
      auVar102 = vmulpd_avx512f(auVar98,local_67c0);
      auVar96 = vaddpd_avx512f(auVar96,auVar103);
      auVar103 = vmulpd_avx512f(auVar94,local_6a80);
      auVar101 = vaddpd_avx512f(auVar103,auVar101);
      auVar103 = vmulpd_avx512f(auVar84,local_6440);
      auVar101 = vaddpd_avx512f(auVar101,auVar102);
      auVar102 = vmulpd_avx512f(auVar95,local_6540);
      auVar101 = vaddpd_avx512f(auVar101,auVar103);
      auVar103 = vmulpd_avx512f(auVar99,local_6640);
      auVar101 = vaddpd_avx512f(auVar101,auVar102);
      auVar102 = vmulpd_avx512f(auVar94,local_6a40);
      auVar94 = vmulpd_avx512f(auVar94,local_6a00);
      auVar101 = vaddpd_avx512f(auVar101,auVar103);
      auVar103 = vmulpd_avx512f(auVar84,local_6400);
      auVar81 = vaddpd_avx512f(auVar102,auVar81);
      auVar102 = vmulpd_avx512f(auVar98,local_6780);
      auVar81 = vaddpd_avx512f(auVar81,auVar102);
      auVar102 = vmulpd_avx512f(auVar95,local_6500);
      auVar81 = vaddpd_avx512f(auVar81,auVar103);
      auVar103 = vmulpd_avx512f(auVar99,local_6600);
      auVar81 = vaddpd_avx512f(auVar81,auVar102);
      auVar98 = vmulpd_avx512f(auVar98,local_6740);
      auVar81 = vaddpd_avx512f(auVar81,auVar103);
      auVar100 = vmulpd_avx512f(auVar100,local_6880);
      auVar94 = vaddpd_avx512f(auVar94,auVar100);
      auVar84 = vmulpd_avx512f(auVar84,local_63c0);
      auVar94 = vaddpd_avx512f(auVar94,auVar98);
      auVar95 = vmulpd_avx512f(auVar95,local_64c0);
      auVar84 = vaddpd_avx512f(auVar94,auVar84);
      auVar94 = vmulpd_avx512f(auVar99,local_65c0);
      auVar84 = vaddpd_avx512f(auVar84,auVar95);
      auVar84 = vaddpd_avx512f(auVar84,auVar94);
      do {
        if ((((~((long)uVar57 >> 0x3f) & uVar57) == uVar69) || ((long)dVar51 < (long)uVar1)) ||
           ((long)dVar51 < lVar75)) goto LAB_007739e8;
        auVar94 = *(undefined1 (*) [64])(pdVar58 + (local_6dd0 - 0x18));
        auVar95 = *(undefined1 (*) [64])(pdVar58 + (long)local_6998 + -0x18);
        auVar98 = *(undefined1 (*) [64])(pdVar58 + local_6da0 + -0x18);
        auVar99 = vmulpd_avx512f(auVar94,auVar80);
        auVar100 = vmulpd_avx512f(auVar96,auVar95);
        auVar102 = vmulpd_avx512f(auVar83,auVar98);
        auVar99 = vaddpd_avx512f(auVar99,auVar100);
        auVar99 = vaddpd_avx512f(auVar99,auVar102);
        pauVar66[-0xb] = auVar99;
        auVar99 = *(undefined1 (*) [64])(pdVar58 + (local_6dd0 - 0x10));
        auVar100 = *(undefined1 (*) [64])(pdVar58 + (long)local_6998 + -0x10);
        auVar102 = *(undefined1 (*) [64])(pdVar58 + local_6da0 + -0x10);
        auVar103 = vmulpd_avx512f(auVar99,local_6980);
        auVar104 = vmulpd_avx512f(auVar101,auVar100);
        auVar105 = vmulpd_avx512f(auVar85,auVar102);
        auVar103 = vaddpd_avx512f(auVar103,auVar104);
        auVar103 = vaddpd_avx512f(auVar103,auVar105);
        pauVar66[-10] = auVar103;
        auVar103 = *(undefined1 (*) [64])(pdVar58 + (local_6dd0 - 8));
        auVar104 = *(undefined1 (*) [64])(pdVar58 + (long)local_6998 + -8);
        auVar105 = vmulpd_avx512f(auVar103,local_6840);
        auVar106 = vmulpd_avx512f(auVar81,auVar104);
        auVar106 = vaddpd_avx512f(auVar105,auVar106);
        auVar105 = *(undefined1 (*) [64])(pdVar58 + local_6da0 + -8);
        auVar107 = vmulpd_avx512f(auVar97,auVar105);
        auVar106 = vaddpd_avx512f(auVar106,auVar107);
        pauVar66[-9] = auVar106;
        auVar106 = *(undefined1 (*) [64])(pdVar58 + local_6dd0);
        auVar107 = *(undefined1 (*) [64])(pdVar58 + (long)local_6998);
        auVar108 = vmulpd_avx512f(auVar106,local_66c0);
        auVar109 = vmulpd_avx512f(auVar84,auVar107);
        auVar109 = vaddpd_avx512f(auVar108,auVar109);
        auVar108 = *(undefined1 (*) [64])(pdVar58 + local_6da0);
        auVar110 = vmulpd_avx512f(auVar78,auVar108);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        pauVar66[-8] = auVar109;
        if ((long)uVar57 <= (long)uVar69 || (long)dVar51 < (long)local_6c80._0_8_)
        goto LAB_007739e8;
        auVar109 = vmulpd_avx512f(auVar95,local_6b00);
        auVar110 = vmulpd_avx512f(auVar96,auVar94);
        auVar94 = vmulpd_avx512f(auVar83,auVar94);
        uVar69 = uVar69 + 1;
        pdVar58 = pdVar58 + (long)dVar51;
        auVar109 = vaddpd_avx512f(auVar110,auVar109);
        auVar110 = vmulpd_avx512f(auVar91,auVar98);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        auVar110 = vmulpd_avx512f(auVar100,local_6700);
        pauVar66[-7] = auVar109;
        auVar109 = vmulpd_avx512f(auVar101,auVar99);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        auVar110 = vmulpd_avx512f(auVar92,auVar102);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        auVar110 = vmulpd_avx512f(auVar79,auVar104);
        pauVar66[-6] = auVar109;
        auVar109 = vmulpd_avx512f(auVar81,auVar103);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        auVar110 = vmulpd_avx512f(auVar90,auVar105);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        auVar110 = vmulpd_avx512f(auVar89,auVar107);
        pauVar66[-5] = auVar109;
        auVar109 = vmulpd_avx512f(auVar84,auVar106);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        auVar110 = vmulpd_avx512f(auVar93,auVar108);
        auVar109 = vaddpd_avx512f(auVar109,auVar110);
        auVar95 = vmulpd_avx512f(auVar91,auVar95);
        auVar99 = vmulpd_avx512f(auVar85,auVar99);
        pauVar66[-4] = auVar109;
        auVar94 = vaddpd_avx512f(auVar94,auVar95);
        auVar95 = vmulpd_avx512f(auVar82,auVar98);
        auVar98 = vmulpd_avx512f(auVar92,auVar100);
        auVar94 = vaddpd_avx512f(auVar94,auVar95);
        auVar95 = vmulpd_avx512f(auVar97,auVar103);
        pauVar66[-3] = auVar94;
        auVar94 = vaddpd_avx512f(auVar99,auVar98);
        auVar98 = vmulpd_avx512f(auVar86,auVar102);
        auVar99 = vmulpd_avx512f(auVar90,auVar104);
        auVar94 = vaddpd_avx512f(auVar94,auVar98);
        pauVar66[-2] = auVar94;
        auVar94 = vaddpd_avx512f(auVar95,auVar99);
        auVar95 = vmulpd_avx512f(auVar87,auVar105);
        auVar98 = vmulpd_avx512f(auVar78,auVar106);
        auVar99 = vmulpd_avx512f(auVar93,auVar107);
        auVar94 = vaddpd_avx512f(auVar94,auVar95);
        pauVar66[-1] = auVar94;
        auVar94 = vaddpd_avx512f(auVar98,auVar99);
        auVar95 = vmulpd_avx512f(auVar88,auVar108);
        auVar94 = vaddpd_avx512f(auVar94,auVar95);
        *pauVar66 = auVar94;
        pauVar66 = pauVar66 + 0xc;
      } while (uVar69 != 0x10);
      lVar56 = 0x10;
      lVar65 = 8;
      pauVar66 = (undefined1 (*) [64])local_30c0;
      lVar72 = 0;
      lVar71 = 0;
      local_4880._0_8_ = uVar57;
      lVar75 = 0;
      local_6c80 = auVar80;
      do {
        local_6da0 = lVar75;
        lVar62 = (dst->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        lVar52 = (dst->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value;
        local_6840._0_8_ = lVar56;
        local_66c0._0_8_ = lVar65;
        local_6700._0_8_ = lVar72;
        local_6b00._0_8_ = pauVar66;
        pdVar53 = (dst->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data;
        lVar75 = lVar62 + 1;
        lVar61 = lVar56 * lVar75;
        lVar70 = lVar65 * lVar75;
        lVar75 = lVar75 * lVar72;
        bVar59 = (long)uVar57 <= local_6da0 || (long)dVar51 < (long)local_6988;
        local_6c80[0] = bVar59;
        pauVar3 = (undefined1 (*) [64])
                  (*(long *)local_6d88 + local_6dc8 + (long)dVar51 * local_6da0 * 8);
        lVar74 = local_6da0 * 3 + 1;
        lVar76 = local_6da0 * 3 + 2;
        lVar64 = 0;
        lVar62 = lVar62 * 0x18;
        lVar73 = 0;
        local_6980._0_8_ = lVar62;
        pauVar67 = pauVar66;
        do {
          local_6990 = dVar51;
          if (bVar59) {
            __function = 
            "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, 96>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = 96, InnerPanel = false]"
            ;
            goto LAB_00773a14;
          }
          if ((lVar52 <= local_6da0 * 3) ||
             ((dst->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_cols.m_value <= lVar71 + lVar73)) {
LAB_007739c6:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                         );
          }
          auVar50._8_8_ = 0;
          auVar50._0_8_ = local_6d98;
          auVar82 = vbroadcastsd_avx512f(auVar50);
          auVar80 = vmulpd_avx512f(auVar82,pauVar3[1]);
          auVar78 = vmulpd_avx512f(auVar82,pauVar3[2]);
          auVar79 = vmulpd_avx512f(auVar82,*pauVar3);
          auVar81 = vmulpd_avx512f(auVar82,pauVar3[4]);
          auVar83 = vmulpd_avx512f(auVar82,pauVar3[7]);
          auVar80 = vmulpd_avx512f(auVar80,pauVar67[-10]);
          auVar78 = vmulpd_avx512f(auVar78,pauVar67[-9]);
          auVar79 = vmulpd_avx512f(auVar79,pauVar67[-0xb]);
          auVar80 = vaddpd_avx512f(auVar80,auVar78);
          auVar78 = vmulpd_avx512f(auVar81,pauVar67[-7]);
          auVar81 = vmulpd_avx512f(auVar82,pauVar3[5]);
          auVar80 = vaddpd_avx512f(auVar79,auVar80);
          auVar79 = vmulpd_avx512f(auVar82,pauVar3[3]);
          auVar81 = vmulpd_avx512f(auVar81,pauVar67[-6]);
          auVar79 = vmulpd_avx512f(auVar79,pauVar67[-8]);
          auVar78 = vaddpd_avx512f(auVar78,auVar81);
          auVar81 = vmulpd_avx512f(auVar82,pauVar3[8]);
          auVar78 = vaddpd_avx512f(auVar79,auVar78);
          auVar79 = vmulpd_avx512f(auVar83,pauVar67[-4]);
          auVar81 = vmulpd_avx512f(auVar81,pauVar67[-3]);
          auVar80 = vaddpd_avx512f(auVar80,auVar78);
          auVar78 = vmulpd_avx512f(auVar82,pauVar3[6]);
          auVar78 = vmulpd_avx512f(auVar78,pauVar67[-5]);
          auVar79 = vaddpd_avx512f(auVar79,auVar81);
          auVar81 = vmulpd_avx512f(auVar82,pauVar3[9]);
          auVar78 = vaddpd_avx512f(auVar78,auVar79);
          auVar79 = vmulpd_avx512f(auVar81,pauVar67[-2]);
          auVar81 = vmulpd_avx512f(auVar82,pauVar3[10]);
          auVar82 = vmulpd_avx512f(auVar82,pauVar3[0xb]);
          auVar81 = vmulpd_avx512f(auVar81,pauVar67[-1]);
          auVar82 = vmulpd_avx512f(auVar82,*pauVar67);
          auVar82 = vaddpd_avx512f(auVar81,auVar82);
          auVar82 = vaddpd_avx512f(auVar79,auVar82);
          auVar82 = vaddpd_avx512f(auVar78,auVar82);
          auVar82 = vaddpd_avx512f(auVar80,auVar82);
          auVar77 = vextractf64x4_avx512f(auVar82,1);
          dVar111 = auVar82._0_8_ + auVar77._0_8_ + auVar82._8_8_ + auVar77._8_8_ +
                    auVar82._16_8_ + auVar77._16_8_ + auVar82._24_8_ + auVar77._24_8_;
          *(double *)((long)pdVar53 + lVar73 * 8 + lVar75) =
               dVar111 + *(double *)((long)pdVar53 + lVar73 * 8 + lVar75);
          if (((lVar52 <= lVar74) ||
              ((lVar4 = lVar71 + 1 + lVar73,
               (dst->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value <= lVar4 ||
               (*(double *)((long)pdVar53 + lVar73 * 8 + lVar70) =
                     dVar111 + *(double *)((long)pdVar53 + lVar73 * 8 + lVar70), lVar52 <= lVar76)))
              ) || (lVar5 = lVar71 + 2 + lVar73,
                   (local_6de0->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value <= lVar5)) goto LAB_007739c6;
          *(double *)((long)pdVar53 + lVar73 * 8 + lVar61) =
               dVar111 + *(double *)((long)pdVar53 + lVar73 * 8 + lVar61);
          if (lVar73 != 0) {
            if (((((lVar52 <= lVar71 + lVar73) ||
                  ((local_6de0->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value <= local_6da0 * 3)) ||
                 (*(double *)((long)pdVar53 + lVar64 + lVar75) =
                       dVar111 + *(double *)((long)pdVar53 + lVar64 + lVar75), lVar52 <= lVar4)) ||
                (((local_6de0->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value <= lVar74 ||
                 (*(double *)((long)pdVar53 + lVar64 + lVar70) =
                       dVar111 + *(double *)((long)pdVar53 + lVar64 + lVar70), lVar52 <= lVar5))))
               || ((local_6de0->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_cols.m_value <= lVar76)) goto LAB_007739c6;
            *(double *)((long)pdVar53 + lVar64 + lVar61) =
                 dVar111 + *(double *)((long)pdVar53 + lVar64 + lVar61);
          }
          lVar64 = lVar64 + lVar62;
          lVar4 = lVar71 + 3 + lVar73;
          pauVar67 = pauVar67 + 0xc;
          lVar73 = lVar73 + 3;
          dst = local_6de0;
        } while (lVar4 != 0x30);
        lVar71 = lVar71 + 3;
        lVar56 = lVar56 + 0x18;
        lVar65 = lVar65 + 0x18;
        lVar72 = lVar72 + 0x18;
        pauVar66 = pauVar66 + 0xc;
        lVar75 = local_6da0 + 1;
      } while (local_6da0 + 1 != 0x10);
      if (local_6e00.m_data != (double *)0x0) {
        free((void *)local_6e00.m_data[-1]);
      }
      uVar57 = local_6dd0;
      if (local_6e20.m_data != (double *)0x0) {
        free((void *)local_6e20.m_data[-1]);
      }
      if (local_6dc0.m_data != (double *)0x0) {
        free((void *)local_6dc0.m_data[-1]);
      }
      local_6dd4 = local_6dd4 + 0x60;
      local_6dd8 = local_6dd8 + 0x60;
      local_6dd0 = (ulong)((int)uVar57 + 0x60);
      lVar75 = local_6d90 + 1;
    } while (lVar75 < this->m_numLayers);
  }
  return;
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalJacobianContIntDamping(ChMatrixRef& H, double Kfactor, double Rfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // Jacobian of the generalized internal force vector is integrated across the volume of the element every time this
    // calculation is performed. For a small number of layers this method can be more efficient than the
    // "Pre-Integration" style calculation method.

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // Zero out the Jacobian matrix since the results from each layer will be added to this value
    H.setZero();

    // Sum the contribution to the Jacobian matrix layer by layer
    for (int kl = 0; kl < m_numLayers; kl++) {
        // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
        // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
        // up the generalized internal force calculation while only having a minimal impact on the performance of the
        // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
        // calculation of the potentially non-symmetric and non-sparse component.  The second pieces is the symmetric
        // and sparse component.

        // =============================================================================
        // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
        // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
        // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31  F11dot  F21dot  F31dot ]
        // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
        //      [F13  F23  F33  F13dot  F23dot  F33dot ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * ebar_ebardot;

        //==============================================================================
        //==============================================================================
        // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
        // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
        // time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP'...
        //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP'...
        //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP'...
        //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP'...
        //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP'...
        //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP']
        // Note that each partial derivative block shown is placed to the left of the previous block.
        // The explanation of the calculation above is just too long to write it all on a single line.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> PE;
        PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            PE.block<1, NIP>(3 * i, 0 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 1 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 2 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 3 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 4 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 5 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());

            PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());

            PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Combine the deformation gradient, time derivative of the deformation gradient, damping coefficient, Gauss
        // quadrature weighting times the element Jacobian, and Jacobian component scale factors into a scaled block
        // deformation gradient matrix Calculate the deformation gradient and time derivative of the deformation
        // gradient for all Gauss quadrature points in a single matrix multiplication.  Note that the resulting combined
        // deformation gradient block matrix will be ordered by block matrix (column vectors) components Note that the
        // indices of the components are in transposed order
        //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks]
        // FCscaled = [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks]
        //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 3> FCscaled = (Kfactor + m_Alpha * Rfactor) * FC.template block<3 * NIP, 3>(0, 0) +
                                                   (m_Alpha * Kfactor) * FC.template block<3 * NIP, 3>(0, 3);

        for (auto i = 0; i < 3; i++) {
            FCscaled.template block<NIP, 1>(0, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(2 * NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
        }

        // =============================================================================
        // Calculate the combination of the scaled partial derivative of the Green-Largrange strains with respect to the
        // nodal coordinates, the scaled partial derivative of the time derivative of the Green-Largrange strains with
        // respect to the nodal coordinates, the scaled partial derivative of the Green-Largrange strains with respect
        // to the time derivative of the nodal coordinates, and the other parameters to correctly integrate across the
        // volume of the element.  This calculation is performed in blocks across all the Gauss quadrature points at the
        // same time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> Scaled_Combined_PE;
        Scaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            Scaled_Combined_PE.block<1, NIP>(3 * i, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer at rotate it in the midsurface according to
        // the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in this
        // element
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Multiply the scaled and combined partial derivative block matrix by the stiffness matrix for each individual
        // Gauss quadrature point
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> DScaled_Combined_PE;
        DScaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 0) =
            D(0, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(0, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(0, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(0, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(0, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(0, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, NIP) =
            D(1, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(1, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(1, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(1, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(1, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(1, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 2 * NIP) =
            D(2, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(2, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(2, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(2, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(2, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(2, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 3 * NIP) =
            D(3, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(3, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(3, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(3, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(3, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(3, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 4 * NIP) =
            D(4, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(4, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(4, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(4, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(4, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(4, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 5 * NIP) =
            D(5, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(5, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(5, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(5, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(5, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(5, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);

        // =============================================================================
        // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
        // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
        // =============================================================================

        H.noalias() += PE * DScaled_Combined_PE.transpose();

        //==============================================================================
        //==============================================================================
        // Calculate the sparse and symmetric component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
        // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
        // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*(E11+alpha*E11dot)
        //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
        VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block *= 0.5;
        E1_Block += m_Alpha * E_BlockDamping;
        E1_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*(E22+alpha*E22dot)
        //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block *= 0.5;
        E2_Block += m_Alpha * E_BlockDamping;
        E2_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*(E33+alpha*E33dot)
        //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block *= 0.5;
        E3_Block += m_Alpha * E_BlockDamping;
        E3_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
        //                  = kGQ*((F12*F13+F22*F23+F32*F33)
        //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
            FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block += m_Alpha * E_BlockDamping;
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
        //                  = kGQ*((F11*F13+F21*F23+F31*F33)
        //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block += m_Alpha * E_BlockDamping;
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
        //                  = kGQ*((F11*F12+F21*F22+F31*F32)
        //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block += m_Alpha * E_BlockDamping;
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
        // quadrature point
        // =============================================================================

        ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

        for (auto i = 0; i < NSF; i++) {
            S_scaled_SD.template block<1, NIP>(i, 0) =
                SPK2_1_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, NIP) =
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_2_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, 2 * NIP) =
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_3_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));
        }

        // =============================================================================
        // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
        // matrix and then expand them out to full size by summing the contribution into the correct locations of the
        // full sized Jacobian matrix
        // =============================================================================
        unsigned int idx = 0;
        for (unsigned int i = 0; i < NSF; i++) {
            for (unsigned int j = i; j < NSF; j++) {
                double d = Kfactor * m_SD.block<1, 3 * NIP>(i, 3 * kl * NIP) *
                           S_scaled_SD.template block<1, 3 * NIP>(j, 0).transpose();

                H(3 * i, 3 * j) += d;
                H(3 * i + 1, 3 * j + 1) += d;
                H(3 * i + 2, 3 * j + 2) += d;
                if (i != j) {
                    H(3 * j, 3 * i) += d;
                    H(3 * j + 1, 3 * i + 1) += d;
                    H(3 * j + 2, 3 * i + 2) += d;
                }
                idx++;
            }
        }
    }
}